

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar14;
  size_t sVar15;
  ulong uVar16;
  emitter_col_t *peVar17;
  char cVar18;
  int iVar19;
  emitter_output_t eVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar22;
  emitter_justify_t *peVar23;
  uint64_t uVar24;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar25;
  emitter_col_t *peVar26;
  long lVar27;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  char *pcVar28;
  emitter_row_t eVar29;
  char *pcVar30;
  char *pcVar31;
  bool bVar32;
  uint64_t uptime_s;
  uint64_t uptime;
  size_t muzzy_bytes;
  size_t nretained;
  size_t nmuzzy;
  size_t sz_1;
  emitter_type_t local_9f0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9e8;
  emitter_col_t *local_9e0;
  emitter_col_t *local_9d8;
  size_t dirty_bytes;
  size_t retained_bytes;
  ulong local_9a8;
  uint64_t uptime_s_5;
  size_t miblen;
  emitter_type_t local_990;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_988;
  emitter_col_t *local_980;
  emitter_col_t *local_978;
  size_t miblen_14;
  size_t ndirty;
  uint nlextents;
  size_t miblen_40;
  emitter_type_t local_8f8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_8f0;
  emitter_col_t *local_8e8;
  emitter_col_t *local_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  char *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  size_t pactive;
  uint nbins;
  uint local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  uint nthreads;
  size_t sz_40;
  emitter_type_t local_820;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_818;
  emitter_col_t *local_810;
  emitter_col_t *local_808;
  size_t tcache_bytes;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t extent_avail;
  size_t metadata_thp;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t pmuzzy;
  size_t pdirty;
  size_t page;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  size_t sz;
  emitter_type_t local_760;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_758 [2];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_748;
  undefined4 local_738;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_730;
  undefined4 local_710;
  ulong local_708 [4];
  undefined4 local_6e8;
  ulong local_6e0;
  undefined4 local_6c0;
  ulong local_6b8 [4];
  undefined4 local_698;
  ulong local_690;
  undefined4 local_670;
  ulong local_668 [4];
  undefined4 local_648;
  ulong local_640;
  undefined4 local_620;
  ulong local_618 [4];
  undefined4 local_5f8;
  ulong local_5f0;
  undefined4 local_5d0;
  undefined1 local_5c8 [24];
  undefined8 local_5b0;
  undefined4 local_5a8;
  char *local_5a0;
  emitter_justify_t *local_598;
  emitter_justify_t *local_590;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests;
  char *dss;
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nrequests_ps;
  emitter_row_t row;
  emitter_col_t local_468;
  emitter_col_t local_440;
  emitter_col_t local_418;
  emitter_col_t local_3f0;
  emitter_col_t col_name;
  emitter_col_t local_3a0;
  emitter_col_t local_378;
  undefined8 local_350;
  undefined4 local_348;
  char *local_340;
  emitter_justify_t *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined4 local_320;
  char *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  char *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  char *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 local_2b0;
  int local_2a8;
  char *local_2a0;
  undefined8 *local_298;
  emitter_justify_t *local_290;
  emitter_col_t local_288;
  emitter_col_t local_260;
  emitter_col_t local_238;
  emitter_col_t local_210;
  emitter_col_t local_1e8;
  emitter_col_t local_1c0;
  emitter_col_t local_198;
  undefined8 local_170;
  undefined4 local_168;
  char *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  emitter_col_t local_148;
  emitter_col_t local_120;
  emitter_col_t local_f8;
  emitter_col_t local_d0;
  emitter_col_t local_a8;
  emitter_col_t local_80;
  emitter_col_t local_58;
  
  local_838 = (undefined4)CONCAT71(in_register_00000089,extents);
  uptime_s_5 = CONCAT44(uptime_s_5._4_4_,(int)CONCAT71(in_register_00000081,mutex));
  local_830 = (undefined4)CONCAT71(in_register_00000009,large);
  local_834 = (undefined4)CONCAT71(in_register_00000011,bins);
  aVar14.uint64_val._4_4_ = 0;
  aVar14.unsigned_val = i;
  sz = 8;
  iVar19 = je_mallctl("arenas.page",&page,&sz,(void *)0x0,0);
  if (iVar19 == 0) {
    miblen = 7;
    sz_1 = 4;
    iVar19 = je_mallctlnametomib("stats.arenas.0.nthreads",&sz,&miblen);
    if (iVar19 == 0) {
      local_758[0] = aVar14;
      iVar19 = je_mallctlbymib(&sz,miblen,&nthreads,&sz_1,(void *)0x0,0);
      if (iVar19 != 0) {
LAB_00147faf:
        malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        abort();
      }
      emitter_kv_note(emitter,"nthreads","assigned threads",emitter_type_unsigned,&nthreads,
                      (char *)0x0,emitter_type_bool,(void *)0x0);
      miblen = 7;
      sz_1 = 8;
      iVar19 = je_mallctlnametomib("stats.arenas.0.uptime",&sz,&miblen);
      if (iVar19 == 0) {
        local_758[0] = aVar14;
        iVar19 = je_mallctlbymib(&sz,miblen,&uptime,&sz_1,(void *)0x0,0);
        if (iVar19 != 0) goto LAB_00147faf;
        emitter_kv_note(emitter,"uptime_ns","uptime",emitter_type_uint64,&uptime,(char *)0x0,
                        emitter_type_bool,(void *)0x0);
        miblen = 7;
        sz_1 = 8;
        iVar19 = je_mallctlnametomib("stats.arenas.0.dss",&sz,&miblen);
        if (iVar19 == 0) {
          local_758[0] = aVar14;
          iVar19 = je_mallctlbymib(&sz,miblen,&dss,&sz_1,(void *)0x0,0);
          if (iVar19 != 0) goto LAB_00147faf;
          emitter_kv_note(emitter,"dss","dss allocation precedence",emitter_type_string,&dss,
                          (char *)0x0,emitter_type_bool,(void *)0x0);
          miblen = 7;
          sz_1 = 8;
          iVar19 = je_mallctlnametomib("stats.arenas.0.dirty_decay_ms",&sz,&miblen);
          if (iVar19 == 0) {
            local_758[0] = aVar14;
            iVar19 = je_mallctlbymib(&sz,miblen,&dirty_decay_ms,&sz_1,(void *)0x0,0);
            if (iVar19 != 0) goto LAB_00147faf;
            miblen = 7;
            sz_1 = 8;
            iVar19 = je_mallctlnametomib("stats.arenas.0.muzzy_decay_ms",&sz,&miblen);
            if (iVar19 == 0) {
              local_758[0] = aVar14;
              iVar19 = je_mallctlbymib(&sz,miblen,&muzzy_decay_ms,&sz_1,(void *)0x0,0);
              if (iVar19 != 0) goto LAB_00147faf;
              miblen = 7;
              sz_1 = 8;
              iVar19 = je_mallctlnametomib("stats.arenas.0.pactive",&sz,&miblen);
              if (iVar19 == 0) {
                local_758[0] = aVar14;
                iVar19 = je_mallctlbymib(&sz,miblen,&pactive,&sz_1,(void *)0x0,0);
                if (iVar19 != 0) goto LAB_00147faf;
                miblen = 7;
                sz_1 = 8;
                iVar19 = je_mallctlnametomib("stats.arenas.0.pdirty",&sz,&miblen);
                if (iVar19 == 0) {
                  local_758[0] = aVar14;
                  iVar19 = je_mallctlbymib(&sz,miblen,&pdirty,&sz_1,(void *)0x0,0);
                  if (iVar19 != 0) goto LAB_00147faf;
                  miblen = 7;
                  sz_1 = 8;
                  iVar19 = je_mallctlnametomib("stats.arenas.0.pmuzzy",&sz,&miblen);
                  if (iVar19 == 0) {
                    local_758[0] = aVar14;
                    iVar19 = je_mallctlbymib(&sz,miblen,&pmuzzy,&sz_1,(void *)0x0,0);
                    if (iVar19 != 0) goto LAB_00147faf;
                    miblen = 7;
                    sz_1 = 8;
                    iVar19 = je_mallctlnametomib("stats.arenas.0.dirty_npurge",&sz,&miblen);
                    if (iVar19 == 0) {
                      local_758[0] = aVar14;
                      iVar19 = je_mallctlbymib(&sz,miblen,&dirty_npurge,&sz_1,(void *)0x0,0);
                      if (iVar19 != 0) goto LAB_00147faf;
                      miblen = 7;
                      sz_1 = 8;
                      iVar19 = je_mallctlnametomib("stats.arenas.0.dirty_nmadvise",&sz,&miblen);
                      if (iVar19 == 0) {
                        local_758[0] = aVar14;
                        iVar19 = je_mallctlbymib(&sz,miblen,&dirty_nmadvise,&sz_1,(void *)0x0,0);
                        if (iVar19 != 0) goto LAB_00147faf;
                        miblen = 7;
                        sz_1 = 8;
                        iVar19 = je_mallctlnametomib("stats.arenas.0.dirty_purged",&sz,&miblen);
                        if (iVar19 == 0) {
                          local_758[0] = aVar14;
                          iVar19 = je_mallctlbymib(&sz,miblen,&dirty_purged,&sz_1,(void *)0x0,0);
                          if (iVar19 != 0) goto LAB_00147faf;
                          miblen = 7;
                          sz_1 = 8;
                          iVar19 = je_mallctlnametomib("stats.arenas.0.muzzy_npurge",&sz,&miblen);
                          if (iVar19 == 0) {
                            local_758[0] = aVar14;
                            iVar19 = je_mallctlbymib(&sz,miblen,&muzzy_npurge,&sz_1,(void *)0x0,0);
                            if (iVar19 != 0) goto LAB_00147faf;
                            miblen = 7;
                            sz_1 = 8;
                            iVar19 = je_mallctlnametomib("stats.arenas.0.muzzy_nmadvise",&sz,&miblen
                                                        );
                            if (iVar19 == 0) {
                              local_758[0] = aVar14;
                              iVar19 = je_mallctlbymib(&sz,miblen,&muzzy_nmadvise,&sz_1,(void *)0x0,
                                                       0);
                              if (iVar19 != 0) goto LAB_00147faf;
                              miblen = 7;
                              sz_1 = 8;
                              iVar19 = je_mallctlnametomib("stats.arenas.0.muzzy_purged",&sz,&miblen
                                                          );
                              if (iVar19 == 0) {
                                local_758[0] = aVar14;
                                iVar19 = je_mallctlbymib(&sz,miblen,&muzzy_purged,&sz_1,(void *)0x0,
                                                         0);
                                if (iVar19 != 0) goto LAB_00147faf;
                                local_83c = i;
                                if (emitter->output == emitter_output_json) {
                                  if (emitter->emitted_key == true) {
                                    emitter->emitted_key = false;
                                  }
                                  else {
                                    pcVar28 = "";
                                    if (emitter->item_at_depth != false) {
                                      pcVar28 = ",";
                                    }
                                    emitter_printf(emitter,"%s\n",pcVar28);
                                    pcVar28 = "\t";
                                    if (emitter->output != emitter_output_json) {
                                      pcVar28 = " ";
                                    }
                                    if (0 < emitter->nesting_depth) {
                                      iVar21 = emitter->nesting_depth <<
                                               (emitter->output != emitter_output_json);
                                      iVar19 = 1;
                                      if (1 < iVar21) {
                                        iVar19 = iVar21;
                                      }
                                      do {
                                        emitter_printf(emitter,"%s",pcVar28);
                                        iVar19 = iVar19 + -1;
                                      } while (iVar19 != 0);
                                    }
                                  }
                                  emitter_printf(emitter,"\"%s\": ","dirty_decay_ms");
                                  emitter->emitted_key = true;
                                  if (emitter->output == emitter_output_json) {
                                    emitter->emitted_key = false;
                                    malloc_snprintf((char *)&sz,10,"%%%s","zd");
                                    emitter_printf(emitter,(char *)&sz,dirty_decay_ms);
                                    emitter->item_at_depth = true;
                                    if (emitter->output == emitter_output_json) {
                                      if (emitter->emitted_key == true) {
                                        emitter->emitted_key = false;
                                      }
                                      else {
                                        emitter_printf(emitter,"%s\n",",");
                                        pcVar28 = "\t";
                                        if (emitter->output != emitter_output_json) {
                                          pcVar28 = " ";
                                        }
                                        if (0 < emitter->nesting_depth) {
                                          iVar21 = emitter->nesting_depth <<
                                                   (emitter->output != emitter_output_json);
                                          iVar19 = 1;
                                          if (1 < iVar21) {
                                            iVar19 = iVar21;
                                          }
                                          do {
                                            emitter_printf(emitter,"%s",pcVar28);
                                            iVar19 = iVar19 + -1;
                                          } while (iVar19 != 0);
                                        }
                                      }
                                      emitter_printf(emitter,"\"%s\": ","muzzy_decay_ms");
                                      emitter->emitted_key = true;
                                      if (emitter->output == emitter_output_json) {
                                        emitter->emitted_key = false;
                                        malloc_snprintf((char *)&sz,10,"%%%s","zd");
                                        emitter_printf(emitter,(char *)&sz,muzzy_decay_ms);
                                        emitter->item_at_depth = true;
                                        if (emitter->output == emitter_output_json) {
                                          if (emitter->emitted_key == true) {
                                            emitter->emitted_key = false;
                                          }
                                          else {
                                            emitter_printf(emitter,"%s\n",",");
                                            pcVar28 = "\t";
                                            if (emitter->output != emitter_output_json) {
                                              pcVar28 = " ";
                                            }
                                            if (0 < emitter->nesting_depth) {
                                              iVar21 = emitter->nesting_depth <<
                                                       (emitter->output != emitter_output_json);
                                              iVar19 = 1;
                                              if (1 < iVar21) {
                                                iVar19 = iVar21;
                                              }
                                              do {
                                                emitter_printf(emitter,"%s",pcVar28);
                                                iVar19 = iVar19 + -1;
                                              } while (iVar19 != 0);
                                            }
                                          }
                                          emitter_printf(emitter,"\"%s\": ","pactive");
                                          emitter->emitted_key = true;
                                          if (emitter->output == emitter_output_json) {
                                            emitter->emitted_key = false;
                                            malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                            emitter_printf(emitter,(char *)&sz,pactive);
                                            emitter->item_at_depth = true;
                                            if (emitter->output == emitter_output_json) {
                                              if (emitter->emitted_key == true) {
                                                emitter->emitted_key = false;
                                              }
                                              else {
                                                emitter_printf(emitter,"%s\n",",");
                                                pcVar28 = "\t";
                                                if (emitter->output != emitter_output_json) {
                                                  pcVar28 = " ";
                                                }
                                                if (0 < emitter->nesting_depth) {
                                                  iVar21 = emitter->nesting_depth <<
                                                           (emitter->output != emitter_output_json);
                                                  iVar19 = 1;
                                                  if (1 < iVar21) {
                                                    iVar19 = iVar21;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar28);
                                                    iVar19 = iVar19 + -1;
                                                  } while (iVar19 != 0);
                                                }
                                              }
                                              emitter_printf(emitter,"\"%s\": ","pdirty");
                                              emitter->emitted_key = true;
                                              if (emitter->output == emitter_output_json) {
                                                emitter->emitted_key = false;
                                                malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                emitter_printf(emitter,(char *)&sz,pdirty);
                                                emitter->item_at_depth = true;
                                                if (emitter->output == emitter_output_json) {
                                                  if (emitter->emitted_key == true) {
                                                    emitter->emitted_key = false;
                                                  }
                                                  else {
                                                    emitter_printf(emitter,"%s\n",",");
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                  }
                                                  emitter_printf(emitter,"\"%s\": ","pmuzzy");
                                                  emitter->emitted_key = true;
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->emitted_key = false;
                                                    malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                    emitter_printf(emitter,(char *)&sz,pmuzzy);
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        emitter_printf(emitter,"%s\n",",");
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "dirty_npurge");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       dirty_npurge);
                                                        emitter->item_at_depth = true;
                                                        if (emitter->output == emitter_output_json)
                                                        {
                                                          if (emitter->emitted_key == true) {
                                                            emitter->emitted_key = false;
                                                          }
                                                          else {
                                                            emitter_printf(emitter,"%s\n",",");
                                                            pcVar28 = "\t";
                                                            if (emitter->output !=
                                                                emitter_output_json) {
                                                              pcVar28 = " ";
                                                            }
                                                            if (0 < emitter->nesting_depth) {
                                                              iVar21 = emitter->nesting_depth <<
                                                                       (emitter->output !=
                                                                       emitter_output_json);
                                                              iVar19 = 1;
                                                              if (1 < iVar21) {
                                                                iVar19 = iVar21;
                                                              }
                                                              do {
                                                                emitter_printf(emitter,"%s",pcVar28)
                                                                ;
                                                                iVar19 = iVar19 + -1;
                                                              } while (iVar19 != 0);
                                                            }
                                                          }
                                                          emitter_printf(emitter,"\"%s\": ",
                                                                         "dirty_nmadvise");
                                                          emitter->emitted_key = true;
                                                          if (emitter->output == emitter_output_json
                                                             ) {
                                                            emitter->emitted_key = false;
                                                            malloc_snprintf((char *)&sz,10,"%%%s",
                                                                            "lu");
                                                            emitter_printf(emitter,(char *)&sz,
                                                                           dirty_nmadvise);
                                                            emitter->item_at_depth = true;
                                                            if (emitter->output ==
                                                                emitter_output_json) {
                                                              if (emitter->emitted_key == true) {
                                                                emitter->emitted_key = false;
                                                              }
                                                              else {
                                                                emitter_printf(emitter,"%s\n",",");
                                                                pcVar28 = "\t";
                                                                if (emitter->output !=
                                                                    emitter_output_json) {
                                                                  pcVar28 = " ";
                                                                }
                                                                if (0 < emitter->nesting_depth) {
                                                                  iVar21 = emitter->nesting_depth <<
                                                                           (emitter->output !=
                                                                           emitter_output_json);
                                                                  iVar19 = 1;
                                                                  if (1 < iVar21) {
                                                                    iVar19 = iVar21;
                                                                  }
                                                                  do {
                                                                    emitter_printf(emitter,"%s",
                                                                                   pcVar28);
                                                                    iVar19 = iVar19 + -1;
                                                                  } while (iVar19 != 0);
                                                                }
                                                              }
                                                              emitter_printf(emitter,"\"%s\": ",
                                                                             "dirty_purged");
                                                              emitter->emitted_key = true;
                                                              if (emitter->output ==
                                                                  emitter_output_json) {
                                                                emitter->emitted_key = false;
                                                                malloc_snprintf((char *)&sz,10,
                                                                                "%%%s","lu");
                                                                emitter_printf(emitter,(char *)&sz,
                                                                               dirty_purged);
                                                                emitter->item_at_depth = true;
                                                                if (emitter->output ==
                                                                    emitter_output_json) {
                                                                  if (emitter->emitted_key == true)
                                                                  {
                                                                    emitter->emitted_key = false;
                                                                  }
                                                                  else {
                                                                    emitter_printf(emitter,"%s\n",
                                                                                   ",");
                                                                    pcVar28 = "\t";
                                                                    if (emitter->output !=
                                                                        emitter_output_json) {
                                                                      pcVar28 = " ";
                                                                    }
                                                                    if (0 < emitter->nesting_depth)
                                                                    {
                                                                      iVar21 = emitter->
                                                  nesting_depth <<
                                                  (emitter->output != emitter_output_json);
                                                  iVar19 = 1;
                                                  if (1 < iVar21) {
                                                    iVar19 = iVar21;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar28);
                                                    iVar19 = iVar19 + -1;
                                                  } while (iVar19 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"\"%s\": ","muzzy_npurge");
                                                  emitter->emitted_key = true;
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->emitted_key = false;
                                                    malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                    emitter_printf(emitter,(char *)&sz,muzzy_npurge)
                                                    ;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        emitter_printf(emitter,"%s\n",",");
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "muzzy_nmadvise");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       muzzy_nmadvise);
                                                        emitter->item_at_depth = true;
                                                        if (emitter->output == emitter_output_json)
                                                        {
                                                          if (emitter->emitted_key == true) {
                                                            emitter->emitted_key = false;
                                                          }
                                                          else {
                                                            emitter_printf(emitter,"%s\n",",");
                                                            pcVar28 = "\t";
                                                            if (emitter->output !=
                                                                emitter_output_json) {
                                                              pcVar28 = " ";
                                                            }
                                                            if (0 < emitter->nesting_depth) {
                                                              iVar21 = emitter->nesting_depth <<
                                                                       (emitter->output !=
                                                                       emitter_output_json);
                                                              iVar19 = 1;
                                                              if (1 < iVar21) {
                                                                iVar19 = iVar21;
                                                              }
                                                              do {
                                                                emitter_printf(emitter,"%s",pcVar28)
                                                                ;
                                                                iVar19 = iVar19 + -1;
                                                              } while (iVar19 != 0);
                                                            }
                                                          }
                                                          emitter_printf(emitter,"\"%s\": ",
                                                                         "muzzy_purged");
                                                          emitter->emitted_key = true;
                                                          if (emitter->output == emitter_output_json
                                                             ) {
                                                            emitter->emitted_key = false;
                                                            malloc_snprintf((char *)&sz,10,"%%%s",
                                                                            "lu");
                                                            emitter_printf(emitter,(char *)&sz,
                                                                           muzzy_purged);
                                                            emitter->item_at_depth = true;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                local_170 = 0x900000001;
                                local_168 = 8;
                                local_160 = "decaying:";
                                local_290 = (emitter_justify_t *)&local_170;
                                local_158 = &local_2b0;
                                local_2b0 = 0x600000001;
                                local_2a8 = 8;
                                local_2a0 = "time";
                                local_2b8 = &local_2b0;
                                local_298 = &local_2d8;
                                local_2d8 = 0xd00000001;
                                local_2d0 = 8;
                                local_2c8 = "npages";
                                local_2e0 = &local_2d8;
                                local_2c0 = &local_300;
                                local_300 = 0xd00000001;
                                local_2f8 = 8;
                                local_2f0 = "sweeps";
                                local_308 = &local_300;
                                local_2e8 = &local_328;
                                local_328 = 0xd00000001;
                                local_320 = 8;
                                local_318 = "madvises";
                                local_330 = &local_328;
                                local_338 = (emitter_justify_t *)&local_170;
                                local_310 = &local_350;
                                local_150 = &local_350;
                                local_350 = 0xd00000001;
                                local_348 = 8;
                                local_340 = "purged";
                                peVar23 = (emitter_justify_t *)&local_170;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar23 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar23,peVar23[1],peVar23[2],
                                                        peVar23 + 4);
                                    peVar23 = *(emitter_justify_t **)(peVar23 + 6);
                                  } while (peVar23 != (emitter_justify_t *)&local_170);
                                  emitter_table_printf(emitter,"\n");
                                }
                                local_160 = "dirty:";
                                local_2a8 = (int)(dirty_decay_ms >> 0x3f) * -2 + 6;
                                pcVar28 = "N/A";
                                if (dirty_decay_ms < 0) {
                                  dirty_decay_ms = (ssize_t)"N/A";
                                }
                                local_2d0 = 5;
                                local_2f8 = 4;
                                local_320 = 4;
                                local_348 = 4;
                                peVar23 = (emitter_justify_t *)&local_170;
                                local_2a0 = (char *)dirty_decay_ms;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar23 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar23,peVar23[1],peVar23[2],
                                                        peVar23 + 4);
                                    peVar23 = *(emitter_justify_t **)(peVar23 + 6);
                                  } while (peVar23 != (emitter_justify_t *)&local_170);
                                  emitter_table_printf(emitter,"\n");
                                }
                                local_160 = "muzzy:";
                                if (-1 < muzzy_decay_ms) {
                                  pcVar28 = (char *)muzzy_decay_ms;
                                }
                                local_2a8 = (int)(muzzy_decay_ms >> 0x3f) * -2 + 6;
                                local_2a0 = pcVar28;
                                local_2d0 = 5;
                                local_2c8 = (char *)pmuzzy;
                                local_2f8 = 4;
                                local_2f0 = (char *)muzzy_npurge;
                                local_320 = 4;
                                local_318 = (char *)muzzy_nmadvise;
                                local_348 = 4;
                                local_340 = (char *)muzzy_purged;
                                peVar23 = (emitter_justify_t *)&local_170;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar23 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar23,peVar23[1],peVar23[2],
                                                        peVar23 + 4);
                                    peVar23 = *(emitter_justify_t **)(peVar23 + 6);
                                  } while (peVar23 != (emitter_justify_t *)&local_170);
                                  emitter_table_printf(emitter,"\n");
                                }
                                local_288.justify = emitter_justify_left;
                                local_288.width = 0x15;
                                local_288.type = emitter_type_title;
                                local_288.field_3.str_val = "";
                                local_3f0.link.qre_prev = &local_288;
                                local_288.link.qre_next = &local_3f0;
                                local_3f0.justify = emitter_justify_right;
                                local_3f0.width = 0x10;
                                local_3f0.type = emitter_type_title;
                                local_3f0.field_3.str_val = "allocated";
                                local_418.link.qre_prev = &local_3f0;
                                local_3f0.link.qre_next = &local_418;
                                local_418.justify = emitter_justify_right;
                                local_418.width = 0x10;
                                local_418.type = emitter_type_title;
                                local_418.field_3.str_val = "nmalloc";
                                local_378.link.qre_prev = &local_418;
                                local_418.link.qre_next = &local_378;
                                local_378.justify = emitter_justify_right;
                                local_378.width = 8;
                                local_378.type = emitter_type_title;
                                local_378.field_3.str_val = "(#/sec)";
                                local_440.link.qre_prev = &local_378;
                                local_378.link.qre_next = &local_440;
                                local_440.justify = emitter_justify_right;
                                local_440.width = 0x10;
                                local_440.type = emitter_type_title;
                                local_440.field_3.str_val = "ndalloc";
                                local_3a0.link.qre_prev = &local_440;
                                local_3a0.link.qre_next = &local_288;
                                local_440.link.qre_next = &local_3a0;
                                local_288.link.qre_prev = &local_3a0;
                                local_3a0.justify = emitter_justify_right;
                                local_3a0.width = 8;
                                local_3a0.type = emitter_type_title;
                                local_3a0.field_3.str_val = "(#/sec)";
                                col_count_nrequests.link.qre_next = &col_count_nrequests;
                                col_count_nrequests.link.qre_prev = &col_count_nrequests;
                                if (&local_288 != (emitter_col_t *)0x0) {
                                  local_288.link.qre_prev = &col_count_nrequests;
                                  col_count_nrequests.link.qre_prev = &local_3a0;
                                  col_count_nrequests.link.qre_next = &local_288;
                                }
                                col_count_nrequests.justify = emitter_justify_right;
                                col_count_nrequests.width = 0x10;
                                col_count_nrequests.type = emitter_type_title;
                                col_count_nrequests.field_3.str_val = "nrequests";
                                col_count_nrequests_ps.link.qre_next = &col_count_nrequests_ps;
                                col_count_nrequests_ps.link.qre_prev = &col_count_nrequests_ps;
                                if (col_count_nrequests.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nrequests_ps.link.qre_prev =
                                       ((col_count_nrequests.link.qre_next)->link).qre_prev;
                                  col_count_nrequests_ps.link.qre_next =
                                       col_count_nrequests.link.qre_next;
                                  ((col_count_nrequests_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nrequests_ps;
                                  ((col_count_nrequests.link.qre_next)->link).qre_prev =
                                       &col_count_nrequests_ps;
                                }
                                peVar26 = col_count_nrequests_ps.link.qre_next;
                                col_count_nrequests_ps.justify = emitter_justify_right;
                                col_count_nrequests_ps.width = 10;
                                col_count_nrequests_ps.type = emitter_type_title;
                                col_count_nrequests_ps.field_3.str_val = "(#/sec)";
                                col_count_nfills.link.qre_next = &col_count_nfills;
                                col_count_nfills.link.qre_prev = &col_count_nfills;
                                if (col_count_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nfills.link.qre_prev =
                                       ((col_count_nrequests_ps.link.qre_next)->link).qre_prev;
                                  col_count_nfills.link.qre_next =
                                       col_count_nrequests_ps.link.qre_next;
                                  ((col_count_nfills.link.qre_prev)->link).qre_next =
                                       &col_count_nfills;
                                  ((col_count_nrequests_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nfills;
                                  col_count_nfills.link.qre_next = peVar26;
                                }
                                col_count_nfills.justify = emitter_justify_right;
                                col_count_nfills.width = 0x10;
                                col_count_nfills.type = emitter_type_title;
                                col_count_nfills.field_3.str_val = "nfill";
                                col_count_nfills_ps.link.qre_next = &col_count_nfills_ps;
                                col_count_nfills_ps.link.qre_prev = &col_count_nfills_ps;
                                if (col_count_nfills.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nfills_ps.link.qre_prev =
                                       ((col_count_nfills.link.qre_next)->link).qre_prev;
                                  col_count_nfills_ps.link.qre_next = col_count_nfills.link.qre_next
                                  ;
                                  ((col_count_nfills_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nfills_ps;
                                  ((col_count_nfills.link.qre_next)->link).qre_prev =
                                       &col_count_nfills_ps;
                                }
                                peVar26 = col_count_nfills_ps.link.qre_next;
                                col_count_nfills_ps.justify = emitter_justify_right;
                                col_count_nfills_ps.width = 10;
                                col_count_nfills_ps.type = emitter_type_title;
                                col_count_nfills_ps.field_3.str_val = "(#/sec)";
                                col_count_nflushes.link.qre_next = &col_count_nflushes;
                                col_count_nflushes.link.qre_prev = &col_count_nflushes;
                                if (col_count_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nflushes.link.qre_prev =
                                       ((col_count_nfills_ps.link.qre_next)->link).qre_prev;
                                  col_count_nflushes.link.qre_next =
                                       col_count_nfills_ps.link.qre_next;
                                  ((col_count_nflushes.link.qre_prev)->link).qre_next =
                                       &col_count_nflushes;
                                  ((col_count_nfills_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nflushes;
                                  col_count_nflushes.link.qre_next = peVar26;
                                }
                                col_count_nflushes.justify = emitter_justify_right;
                                col_count_nflushes.width = 0x10;
                                col_count_nflushes.type = emitter_type_title;
                                col_count_nflushes.field_3.str_val = "nflush";
                                col_count_nflushes_ps.link.qre_next = &col_count_nflushes_ps;
                                col_count_nflushes_ps.link.qre_prev = &col_count_nflushes_ps;
                                if (col_count_nflushes.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nflushes_ps.link.qre_prev =
                                       ((col_count_nflushes.link.qre_next)->link).qre_prev;
                                  col_count_nflushes_ps.link.qre_next =
                                       col_count_nflushes.link.qre_next;
                                  ((col_count_nflushes_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nflushes_ps;
                                  ((col_count_nflushes.link.qre_next)->link).qre_prev =
                                       &col_count_nflushes_ps;
                                }
                                peVar17 = col_count_nflushes_ps.link.qre_next;
                                col_count_nflushes_ps.justify = emitter_justify_right;
                                col_count_nflushes_ps.width = 10;
                                col_count_nflushes_ps.type = emitter_type_title;
                                col_count_nflushes_ps.field_3.str_val = "(#/sec)";
                                eVar20 = emitter->output;
                                peVar26 = col_count_nflushes_ps.link.qre_next;
                                if (eVar20 == emitter_output_table) {
                                  do {
                                    if (peVar26 == (emitter_col_t *)0x0) break;
                                    emitter_print_value(emitter,peVar26->justify,peVar26->width,
                                                        peVar26->type,&peVar26->field_3);
                                    peVar26 = (peVar26->link).qre_next;
                                  } while (peVar26 != peVar17);
                                  emitter_table_printf(emitter,"\n");
                                  eVar20 = emitter->output;
                                }
                                local_378.type = emitter_type_uint64;
                                local_3a0.type = emitter_type_uint64;
                                col_count_nrequests_ps.type = emitter_type_uint64;
                                col_count_nfills_ps.type = emitter_type_uint64;
                                col_count_nflushes_ps.type = emitter_type_uint64;
                                if (eVar20 == emitter_output_json) {
                                  if (emitter->emitted_key == true) {
                                    emitter->emitted_key = false;
                                  }
                                  else {
                                    pcVar28 = ",";
                                    if (emitter->item_at_depth == false) {
                                      pcVar28 = "";
                                    }
                                    emitter_printf(emitter,"%s\n",pcVar28);
                                    pcVar28 = "\t";
                                    if (emitter->output != emitter_output_json) {
                                      pcVar28 = " ";
                                    }
                                    if (0 < emitter->nesting_depth) {
                                      iVar21 = emitter->nesting_depth <<
                                               (emitter->output != emitter_output_json);
                                      iVar19 = 1;
                                      if (1 < iVar21) {
                                        iVar19 = iVar21;
                                      }
                                      do {
                                        emitter_printf(emitter,"%s",pcVar28);
                                        iVar19 = iVar19 + -1;
                                      } while (iVar19 != 0);
                                    }
                                  }
                                  emitter_printf(emitter,"\"%s\": ","small");
                                  emitter->emitted_key = true;
                                  if (emitter->output == emitter_output_json) {
                                    emitter->emitted_key = false;
                                    emitter_printf(emitter,"{");
                                    emitter->nesting_depth = emitter->nesting_depth + 1;
                                    emitter->item_at_depth = false;
                                  }
                                }
                                local_288.field_3.str_val = "small:";
                                miblen = 7;
                                sz_1 = 8;
                                iVar19 = je_mallctlnametomib("stats.arenas.0.small.allocated",&sz,
                                                             &miblen);
                                if (iVar19 == 0) {
                                  local_758[0] = aVar14;
                                  iVar19 = je_mallctlbymib(&sz,miblen,&small_allocated,&sz_1,
                                                           (void *)0x0,0);
                                  if (iVar19 != 0) goto LAB_00147faf;
                                  if (emitter->output == emitter_output_json) {
                                    if (emitter->emitted_key == true) {
                                      emitter->emitted_key = false;
                                    }
                                    else {
                                      pcVar28 = ",";
                                      if (emitter->item_at_depth == false) {
                                        pcVar28 = "";
                                      }
                                      emitter_printf(emitter,"%s\n",pcVar28);
                                      pcVar28 = "\t";
                                      if (emitter->output != emitter_output_json) {
                                        pcVar28 = " ";
                                      }
                                      if (0 < emitter->nesting_depth) {
                                        iVar21 = emitter->nesting_depth <<
                                                 (emitter->output != emitter_output_json);
                                        iVar19 = 1;
                                        if (1 < iVar21) {
                                          iVar19 = iVar21;
                                        }
                                        do {
                                          emitter_printf(emitter,"%s",pcVar28);
                                          iVar19 = iVar19 + -1;
                                        } while (iVar19 != 0);
                                      }
                                    }
                                    emitter_printf(emitter,"\"%s\": ","allocated");
                                    emitter->emitted_key = true;
                                    if (emitter->output == emitter_output_json) {
                                      emitter->emitted_key = false;
                                      malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                      emitter_printf(emitter,(char *)&sz,small_allocated);
                                      emitter->item_at_depth = true;
                                    }
                                  }
                                  local_3f0.type = emitter_type_size;
                                  local_3f0.field_3.size_val = small_allocated;
                                  miblen = 7;
                                  sz_1 = 8;
                                  iVar19 = je_mallctlnametomib("stats.arenas.0.small.nmalloc",&sz,
                                                               &miblen);
                                  if (iVar19 == 0) {
                                    local_758[0] = aVar14;
                                    iVar19 = je_mallctlbymib(&sz,miblen,&small_nmalloc,&sz_1,
                                                             (void *)0x0,0);
                                    if (iVar19 != 0) goto LAB_00147faf;
                                    if (emitter->output == emitter_output_json) {
                                      if (emitter->emitted_key == true) {
                                        emitter->emitted_key = false;
                                      }
                                      else {
                                        pcVar28 = ",";
                                        if (emitter->item_at_depth == false) {
                                          pcVar28 = "";
                                        }
                                        emitter_printf(emitter,"%s\n",pcVar28);
                                        pcVar28 = "\t";
                                        if (emitter->output != emitter_output_json) {
                                          pcVar28 = " ";
                                        }
                                        if (0 < emitter->nesting_depth) {
                                          iVar21 = emitter->nesting_depth <<
                                                   (emitter->output != emitter_output_json);
                                          iVar19 = 1;
                                          if (1 < iVar21) {
                                            iVar19 = iVar21;
                                          }
                                          do {
                                            emitter_printf(emitter,"%s",pcVar28);
                                            iVar19 = iVar19 + -1;
                                          } while (iVar19 != 0);
                                        }
                                      }
                                      emitter_printf(emitter,"\"%s\": ","nmalloc");
                                      emitter->emitted_key = true;
                                      if (emitter->output == emitter_output_json) {
                                        emitter->emitted_key = false;
                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                        emitter_printf(emitter,(char *)&sz,small_nmalloc);
                                        emitter->item_at_depth = true;
                                      }
                                    }
                                    local_418.type = emitter_type_uint64;
                                    local_418.field_3.uint64_val = small_nmalloc;
                                    if (small_nmalloc == 0 || uptime == 0) {
                                      local_378.field_3.uint64_val = 0;
                                    }
                                    else {
                                      local_378.field_3.uint64_val = small_nmalloc;
                                      if (999999999 < uptime) {
                                        auVar1._8_8_ = 0;
                                        auVar1._0_8_ = small_nmalloc;
                                        local_378.field_3.uint64_val =
                                             SUB168(auVar1 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53)
                                                              >> 0x4b &
                                                             (undefined1  [16])0x1fffffffffffff),0);
                                      }
                                    }
                                    miblen = 7;
                                    sz_1 = 8;
                                    iVar19 = je_mallctlnametomib("stats.arenas.0.small.ndalloc",&sz,
                                                                 &miblen);
                                    if (iVar19 == 0) {
                                      local_758[0] = aVar14;
                                      iVar19 = je_mallctlbymib(&sz,miblen,&small_ndalloc,&sz_1,
                                                               (void *)0x0,0);
                                      if (iVar19 != 0) goto LAB_00147faf;
                                      if (emitter->output == emitter_output_json) {
                                        if (emitter->emitted_key == true) {
                                          emitter->emitted_key = false;
                                        }
                                        else {
                                          pcVar28 = ",";
                                          if (emitter->item_at_depth == false) {
                                            pcVar28 = "";
                                          }
                                          emitter_printf(emitter,"%s\n",pcVar28);
                                          pcVar28 = "\t";
                                          if (emitter->output != emitter_output_json) {
                                            pcVar28 = " ";
                                          }
                                          if (0 < emitter->nesting_depth) {
                                            iVar21 = emitter->nesting_depth <<
                                                     (emitter->output != emitter_output_json);
                                            iVar19 = 1;
                                            if (1 < iVar21) {
                                              iVar19 = iVar21;
                                            }
                                            do {
                                              emitter_printf(emitter,"%s",pcVar28);
                                              iVar19 = iVar19 + -1;
                                            } while (iVar19 != 0);
                                          }
                                        }
                                        emitter_printf(emitter,"\"%s\": ","ndalloc");
                                        emitter->emitted_key = true;
                                        if (emitter->output == emitter_output_json) {
                                          emitter->emitted_key = false;
                                          malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                          emitter_printf(emitter,(char *)&sz,small_ndalloc);
                                          emitter->item_at_depth = true;
                                        }
                                      }
                                      local_440.type = emitter_type_uint64;
                                      local_440.field_3.uint64_val = small_ndalloc;
                                      if (small_ndalloc == 0 || uptime == 0) {
                                        local_3a0.field_3.uint64_val = 0;
                                      }
                                      else {
                                        local_3a0.field_3.uint64_val = small_ndalloc;
                                        if (999999999 < uptime) {
                                          auVar2._8_8_ = 0;
                                          auVar2._0_8_ = small_ndalloc;
                                          local_3a0.field_3.uint64_val =
                                               SUB168(auVar2 / (ZEXT816(0) *
                                                                ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                                               (undefined1  [16])0x1fffffffffffff),0
                                                     );
                                        }
                                      }
                                      miblen = 7;
                                      sz_1 = 8;
                                      iVar19 = je_mallctlnametomib("stats.arenas.0.small.nrequests",
                                                                   &sz,&miblen);
                                      if (iVar19 == 0) {
                                        local_758[0] = aVar14;
                                        iVar19 = je_mallctlbymib(&sz,miblen,&small_nrequests,&sz_1,
                                                                 (void *)0x0,0);
                                        if (iVar19 != 0) goto LAB_00147faf;
                                        if (emitter->output == emitter_output_json) {
                                          if (emitter->emitted_key == true) {
                                            emitter->emitted_key = false;
                                          }
                                          else {
                                            pcVar28 = ",";
                                            if (emitter->item_at_depth == false) {
                                              pcVar28 = "";
                                            }
                                            emitter_printf(emitter,"%s\n",pcVar28);
                                            pcVar28 = "\t";
                                            if (emitter->output != emitter_output_json) {
                                              pcVar28 = " ";
                                            }
                                            if (0 < emitter->nesting_depth) {
                                              iVar21 = emitter->nesting_depth <<
                                                       (emitter->output != emitter_output_json);
                                              iVar19 = 1;
                                              if (1 < iVar21) {
                                                iVar19 = iVar21;
                                              }
                                              do {
                                                emitter_printf(emitter,"%s",pcVar28);
                                                iVar19 = iVar19 + -1;
                                              } while (iVar19 != 0);
                                            }
                                          }
                                          emitter_printf(emitter,"\"%s\": ","nrequests");
                                          emitter->emitted_key = true;
                                          if (emitter->output == emitter_output_json) {
                                            emitter->emitted_key = false;
                                            malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                            emitter_printf(emitter,(char *)&sz,small_nrequests);
                                            emitter->item_at_depth = true;
                                          }
                                        }
                                        col_count_nrequests.type = emitter_type_uint64;
                                        col_count_nrequests.field_3.uint64_val = small_nrequests;
                                        if (small_nrequests == 0 || uptime == 0) {
                                          col_count_nrequests_ps.field_3.uint64_val = 0;
                                        }
                                        else {
                                          col_count_nrequests_ps.field_3.uint64_val =
                                               small_nrequests;
                                          if (999999999 < uptime) {
                                            auVar3._8_8_ = 0;
                                            auVar3._0_8_ = small_nrequests;
                                            col_count_nrequests_ps.field_3.uint64_val =
                                                 SUB168(auVar3 / (ZEXT816(0) *
                                                                  ZEXT816(0x44b82fa09b5a53) >> 0x4b
                                                                 & (undefined1  [16])
                                                                   0x1fffffffffffff),0);
                                          }
                                        }
                                        miblen = 7;
                                        sz_1 = 8;
                                        iVar19 = je_mallctlnametomib("stats.arenas.0.small.nfills",
                                                                     &sz,&miblen);
                                        if (iVar19 == 0) {
                                          local_758[0] = aVar14;
                                          iVar19 = je_mallctlbymib(&sz,miblen,&small_nfills,&sz_1,
                                                                   (void *)0x0,0);
                                          if (iVar19 != 0) goto LAB_00147faf;
                                          if (emitter->output == emitter_output_json) {
                                            if (emitter->emitted_key == true) {
                                              emitter->emitted_key = false;
                                            }
                                            else {
                                              pcVar28 = ",";
                                              if (emitter->item_at_depth == false) {
                                                pcVar28 = "";
                                              }
                                              emitter_printf(emitter,"%s\n",pcVar28);
                                              pcVar28 = "\t";
                                              if (emitter->output != emitter_output_json) {
                                                pcVar28 = " ";
                                              }
                                              if (0 < emitter->nesting_depth) {
                                                iVar21 = emitter->nesting_depth <<
                                                         (emitter->output != emitter_output_json);
                                                iVar19 = 1;
                                                if (1 < iVar21) {
                                                  iVar19 = iVar21;
                                                }
                                                do {
                                                  emitter_printf(emitter,"%s",pcVar28);
                                                  iVar19 = iVar19 + -1;
                                                } while (iVar19 != 0);
                                              }
                                            }
                                            emitter_printf(emitter,"\"%s\": ","nfills");
                                            emitter->emitted_key = true;
                                            if (emitter->output == emitter_output_json) {
                                              emitter->emitted_key = false;
                                              malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                              emitter_printf(emitter,(char *)&sz,small_nfills);
                                              emitter->item_at_depth = true;
                                            }
                                          }
                                          col_count_nfills.type = emitter_type_uint64;
                                          col_count_nfills.field_3.uint64_val = small_nfills;
                                          if (small_nfills == 0 || uptime == 0) {
                                            col_count_nfills_ps.field_3.uint64_val = 0;
                                          }
                                          else {
                                            col_count_nfills_ps.field_3.uint64_val = small_nfills;
                                            if (999999999 < uptime) {
                                              auVar4._8_8_ = 0;
                                              auVar4._0_8_ = small_nfills;
                                              col_count_nfills_ps.field_3.uint64_val =
                                                   SUB168(auVar4 / (ZEXT816(0) *
                                                                    ZEXT816(0x44b82fa09b5a53) >>
                                                                    0x4b & (undefined1  [16])
                                                                           0x1fffffffffffff),0);
                                            }
                                          }
                                          miblen = 7;
                                          sz_1 = 8;
                                          iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.small.nflushes",&sz,&miblen);
                                          if (iVar19 == 0) {
                                            local_758[0] = aVar14;
                                            iVar19 = je_mallctlbymib(&sz,miblen,&small_nflushes,
                                                                     &sz_1,(void *)0x0,0);
                                            if (iVar19 != 0) goto LAB_00147faf;
                                            if (emitter->output == emitter_output_json) {
                                              if (emitter->emitted_key == true) {
                                                emitter->emitted_key = false;
                                              }
                                              else {
                                                pcVar28 = ",";
                                                if (emitter->item_at_depth == false) {
                                                  pcVar28 = "";
                                                }
                                                emitter_printf(emitter,"%s\n",pcVar28);
                                                pcVar28 = "\t";
                                                if (emitter->output != emitter_output_json) {
                                                  pcVar28 = " ";
                                                }
                                                if (0 < emitter->nesting_depth) {
                                                  iVar21 = emitter->nesting_depth <<
                                                           (emitter->output != emitter_output_json);
                                                  iVar19 = 1;
                                                  if (1 < iVar21) {
                                                    iVar19 = iVar21;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar28);
                                                    iVar19 = iVar19 + -1;
                                                  } while (iVar19 != 0);
                                                }
                                              }
                                              emitter_printf(emitter,"\"%s\": ","nflushes");
                                              emitter->emitted_key = true;
                                              if (emitter->output == emitter_output_json) {
                                                emitter->emitted_key = false;
                                                malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                emitter_printf(emitter,(char *)&sz,small_nflushes);
                                                emitter->item_at_depth = true;
                                              }
                                            }
                                            col_count_nflushes.type = emitter_type_uint64;
                                            col_count_nflushes.field_3.uint64_val = small_nflushes;
                                            if (small_nflushes == 0 || uptime == 0) {
                                              col_count_nflushes_ps.field_3.uint64_val = 0;
                                            }
                                            else {
                                              col_count_nflushes_ps.field_3.uint64_val =
                                                   small_nflushes;
                                              if (999999999 < uptime) {
                                                auVar5._8_8_ = 0;
                                                auVar5._0_8_ = small_nflushes;
                                                col_count_nflushes_ps.field_3 =
                                                     SUB168(auVar5 / (ZEXT816(0) *
                                                                      ZEXT816(0x44b82fa09b5a53) >>
                                                                      0x4b & (undefined1  [16])
                                                                             0x1fffffffffffff),0);
                                              }
                                            }
                                            eVar20 = emitter->output;
                                            peVar26 = peVar17;
                                            if (eVar20 == emitter_output_table) {
                                              do {
                                                if (peVar26 == (emitter_col_t *)0x0) break;
                                                emitter_print_value(emitter,peVar26->justify,
                                                                    peVar26->width,peVar26->type,
                                                                    &peVar26->field_3);
                                                peVar26 = (peVar26->link).qre_next;
                                              } while (peVar26 != peVar17);
                                              emitter_table_printf(emitter,"\n");
                                              eVar20 = emitter->output;
                                            }
                                            if (eVar20 == emitter_output_json) {
                                              emitter->nesting_depth = emitter->nesting_depth + -1;
                                              emitter->item_at_depth = true;
                                              emitter_printf(emitter,"\n");
                                              pcVar28 = "\t";
                                              pcVar30 = "\t";
                                              if (emitter->output != emitter_output_json) {
                                                pcVar30 = " ";
                                              }
                                              if (0 < emitter->nesting_depth) {
                                                iVar21 = emitter->nesting_depth <<
                                                         (emitter->output != emitter_output_json);
                                                iVar19 = 1;
                                                if (1 < iVar21) {
                                                  iVar19 = iVar21;
                                                }
                                                do {
                                                  emitter_printf(emitter,"%s",pcVar30);
                                                  iVar19 = iVar19 + -1;
                                                } while (iVar19 != 0);
                                              }
                                              emitter_printf(emitter,"}");
                                              if (emitter->output == emitter_output_json) {
                                                if (emitter->emitted_key == true) {
                                                  emitter->emitted_key = false;
                                                }
                                                else {
                                                  pcVar30 = ",";
                                                  if (emitter->item_at_depth == false) {
                                                    pcVar30 = "";
                                                  }
                                                  emitter_printf(emitter,"%s\n",pcVar30);
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar28 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar21 = emitter->nesting_depth <<
                                                             (emitter->output != emitter_output_json
                                                             );
                                                    iVar19 = 1;
                                                    if (1 < iVar21) {
                                                      iVar19 = iVar21;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar28);
                                                      iVar19 = iVar19 + -1;
                                                    } while (iVar19 != 0);
                                                  }
                                                }
                                                emitter_printf(emitter,"\"%s\": ","large");
                                                emitter->emitted_key = true;
                                                if (emitter->output == emitter_output_json) {
                                                  emitter->emitted_key = false;
                                                  emitter_printf(emitter,"{");
                                                  emitter->nesting_depth =
                                                       emitter->nesting_depth + 1;
                                                  emitter->item_at_depth = false;
                                                }
                                              }
                                            }
                                            local_288.field_3.str_val = "large:";
                                            miblen = 7;
                                            sz_1 = 8;
                                            iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.allocated",&sz,&miblen);
                                            if (iVar19 == 0) {
                                              local_758[0] = aVar14;
                                              iVar19 = je_mallctlbymib(&sz,miblen,&large_allocated,
                                                                       &sz_1,(void *)0x0,0);
                                              if (iVar19 != 0) goto LAB_00147faf;
                                              if (emitter->output == emitter_output_json) {
                                                if (emitter->emitted_key == true) {
                                                  emitter->emitted_key = false;
                                                }
                                                else {
                                                  pcVar28 = ",";
                                                  if (emitter->item_at_depth == false) {
                                                    pcVar28 = "";
                                                  }
                                                  emitter_printf(emitter,"%s\n",pcVar28);
                                                  pcVar28 = "\t";
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar28 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar21 = emitter->nesting_depth <<
                                                             (emitter->output != emitter_output_json
                                                             );
                                                    iVar19 = 1;
                                                    if (1 < iVar21) {
                                                      iVar19 = iVar21;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar28);
                                                      iVar19 = iVar19 + -1;
                                                    } while (iVar19 != 0);
                                                  }
                                                }
                                                emitter_printf(emitter,"\"%s\": ","allocated");
                                                emitter->emitted_key = true;
                                                if (emitter->output == emitter_output_json) {
                                                  emitter->emitted_key = false;
                                                  malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                  emitter_printf(emitter,(char *)&sz,large_allocated
                                                                );
                                                  emitter->item_at_depth = true;
                                                }
                                              }
                                              local_3f0.type = emitter_type_size;
                                              local_3f0.field_3.size_val = large_allocated;
                                              miblen = 7;
                                              sz_1 = 8;
                                              iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.nmalloc",&sz,&miblen);
                                              if (iVar19 == 0) {
                                                local_758[0] = aVar14;
                                                iVar19 = je_mallctlbymib(&sz,miblen,&large_nmalloc,
                                                                         &sz_1,(void *)0x0,0);
                                                if (iVar19 != 0) goto LAB_00147faf;
                                                if (emitter->output == emitter_output_json) {
                                                  if (emitter->emitted_key == true) {
                                                    emitter->emitted_key = false;
                                                  }
                                                  else {
                                                    pcVar28 = ",";
                                                    if (emitter->item_at_depth == false) {
                                                      pcVar28 = "";
                                                    }
                                                    emitter_printf(emitter,"%s\n",pcVar28);
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                  }
                                                  emitter_printf(emitter,"\"%s\": ","nmalloc");
                                                  emitter->emitted_key = true;
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->emitted_key = false;
                                                    malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                    emitter_printf(emitter,(char *)&sz,large_nmalloc
                                                                  );
                                                    emitter->item_at_depth = true;
                                                  }
                                                }
                                                local_418.type = emitter_type_uint64;
                                                local_418.field_3.uint64_val = large_nmalloc;
                                                if (large_nmalloc == 0 || uptime == 0) {
                                                  local_378.field_3.uint64_val = 0;
                                                }
                                                else {
                                                  local_378.field_3.uint64_val = large_nmalloc;
                                                  if (999999999 < uptime) {
                                                    auVar6._8_8_ = 0;
                                                    auVar6._0_8_ = large_nmalloc;
                                                    local_378.field_3.uint64_val =
                                                         SUB168(auVar6 / (ZEXT816(0) *
                                                                          ZEXT816(0x44b82fa09b5a53)
                                                                          >> 0x4b &
                                                                         (undefined1  [16])
                                                                         0x1fffffffffffff),0);
                                                  }
                                                }
                                                miblen = 7;
                                                sz_1 = 8;
                                                iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.ndalloc",&sz,&miblen);
                                                if (iVar19 == 0) {
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,miblen,&large_ndalloc
                                                                           ,&sz_1,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  if (emitter->output == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar28 = ",";
                                                      if (emitter->item_at_depth == false) {
                                                        pcVar28 = "";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar28);
                                                      pcVar28 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar28 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar21 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        iVar19 = 1;
                                                        if (1 < iVar21) {
                                                          iVar19 = iVar21;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar28);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"\"%s\": ","ndalloc");
                                                    emitter->emitted_key = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      emitter->emitted_key = false;
                                                      malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                      emitter_printf(emitter,(char *)&sz,
                                                                     large_ndalloc);
                                                      emitter->item_at_depth = true;
                                                    }
                                                  }
                                                  local_440.type = emitter_type_uint64;
                                                  local_440.field_3.uint64_val = large_ndalloc;
                                                  if (large_ndalloc == 0 || uptime == 0) {
                                                    local_3a0.field_3.uint64_val = 0;
                                                  }
                                                  else {
                                                    local_3a0.field_3.uint64_val = large_ndalloc;
                                                    if (999999999 < uptime) {
                                                      auVar7._8_8_ = 0;
                                                      auVar7._0_8_ = large_ndalloc;
                                                      local_3a0.field_3.uint64_val =
                                                           SUB168(auVar7 / (ZEXT816(0) *
                                                                            ZEXT816(0x44b82fa09b5a53
                                                                                   ) >> 0x4b &
                                                                           (undefined1  [16])
                                                                           0x1fffffffffffff),0);
                                                    }
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.nrequests",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &large_nrequests,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","nrequests")
                                                      ;
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       large_nrequests);
                                                        emitter->item_at_depth = true;
                                                      }
                                                    }
                                                    col_count_nrequests.type = emitter_type_uint64;
                                                    col_count_nrequests.field_3.uint64_val =
                                                         large_nrequests;
                                                    if (large_nrequests == 0 || uptime == 0) {
                                                      col_count_nrequests_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nrequests_ps.field_3.uint64_val =
                                                           large_nrequests;
                                                      if (999999999 < uptime) {
                                                        auVar8._8_8_ = 0;
                                                        auVar8._0_8_ = large_nrequests;
                                                        col_count_nrequests_ps.field_3.uint64_val =
                                                             SUB168(auVar8 / (ZEXT816(0) *
                                                                              ZEXT816(
                                                  0x44b82fa09b5a53) >> 0x4b &
                                                  (undefined1  [16])0x1fffffffffffff),0);
                                                  }
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.nfills",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &large_nfills,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","nfills");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       large_nfills);
                                                        emitter->item_at_depth = true;
                                                      }
                                                    }
                                                    col_count_nfills.type = emitter_type_uint64;
                                                    col_count_nfills.field_3.uint64_val =
                                                         large_nfills;
                                                    if (large_nfills == 0 || uptime == 0) {
                                                      col_count_nfills_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nfills_ps.field_3.uint64_val =
                                                           large_nfills;
                                                      if (999999999 < uptime) {
                                                        auVar9._8_8_ = 0;
                                                        auVar9._0_8_ = large_nfills;
                                                        col_count_nfills_ps.field_3.uint64_val =
                                                             SUB168(auVar9 / (ZEXT816(0) *
                                                                              ZEXT816(
                                                  0x44b82fa09b5a53) >> 0x4b &
                                                  (undefined1  [16])0x1fffffffffffff),0);
                                                  }
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.large.nflushes",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &large_nflushes,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","nflushes");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","lu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       large_nflushes);
                                                        emitter->item_at_depth = true;
                                                      }
                                                    }
                                                    col_count_nflushes.type = emitter_type_uint64;
                                                    col_count_nflushes.field_3.uint64_val =
                                                         large_nflushes;
                                                    if (large_nflushes == 0 || uptime == 0) {
                                                      col_count_nflushes_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nflushes_ps.field_3.uint64_val =
                                                           large_nflushes;
                                                      if (999999999 < uptime) {
                                                        auVar10._8_8_ = 0;
                                                        auVar10._0_8_ = large_nflushes;
                                                        col_count_nflushes_ps.field_3 =
                                                             SUB168(auVar10 / (ZEXT816(0) *
                                                                               ZEXT816(
                                                  0x44b82fa09b5a53) >> 0x4b &
                                                  (undefined1  [16])0x1fffffffffffff),0);
                                                  }
                                                  }
                                                  eVar20 = emitter->output;
                                                  peVar26 = peVar17;
                                                  if (eVar20 == emitter_output_table) {
                                                    do {
                                                      if (peVar26 == (emitter_col_t *)0x0) break;
                                                      emitter_print_value(emitter,peVar26->justify,
                                                                          peVar26->width,
                                                                          peVar26->type,
                                                                          &peVar26->field_3);
                                                      peVar26 = (peVar26->link).qre_next;
                                                    } while (peVar26 != peVar17);
                                                    emitter_table_printf(emitter,"\n");
                                                    eVar20 = emitter->output;
                                                  }
                                                  if (eVar20 == emitter_output_json) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    emitter_printf(emitter,"\n");
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  local_3a0.field_3.str_val =
                                                       (char *)(large_ndalloc + small_ndalloc);
                                                  local_288.field_3.str_val = "total:";
                                                  col_count_nrequests_ps.field_3.str_val =
                                                       (char *)(large_nrequests + small_nrequests);
                                                  local_3f0.field_3.str_val =
                                                       (char *)(large_allocated + small_allocated);
                                                  col_count_nfills_ps.field_3.str_val =
                                                       (char *)(large_nfills + small_nfills);
                                                  col_count_nflushes_ps.field_3.str_val =
                                                       (char *)(large_nflushes + small_nflushes);
                                                  local_378.field_3.str_val =
                                                       (char *)(large_nmalloc + small_nmalloc);
                                                  local_418.field_3.uint64_val =
                                                       (uint64_t)local_378.field_3;
                                                  local_440.field_3.uint64_val =
                                                       (uint64_t)local_3a0.field_3;
                                                  col_count_nrequests.field_3.uint64_val =
                                                       (uint64_t)col_count_nrequests_ps.field_3;
                                                  col_count_nfills.field_3.uint64_val =
                                                       (uint64_t)col_count_nfills_ps.field_3;
                                                  col_count_nflushes.field_3 =
                                                       col_count_nflushes_ps.field_3;
                                                  if (uptime == 0 ||
                                                      (char *)local_378.field_3.uint64_val ==
                                                      (char *)0x0) {
                                                    local_378.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    auVar11._8_8_ = 0;
                                                    auVar11._0_8_ = local_378.field_3;
                                                    local_378.field_3 =
                                                         SUB168(auVar11 / (ZEXT816(0) *
                                                                           ZEXT816(0x44b82fa09b5a53)
                                                                           >> 0x4b &
                                                                          (undefined1  [16])
                                                                          0x1fffffffffffff),0);
                                                  }
                                                  if ((char *)local_3a0.field_3.uint64_val ==
                                                      (char *)0x0 || uptime == 0) {
                                                    local_3a0.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    auVar12._8_8_ = 0;
                                                    auVar12._0_8_ = local_3a0.field_3;
                                                    local_3a0.field_3 =
                                                         SUB168(auVar12 / (ZEXT816(0) *
                                                                           ZEXT816(0x44b82fa09b5a53)
                                                                           >> 0x4b &
                                                                          (undefined1  [16])
                                                                          0x1fffffffffffff),0);
                                                  }
                                                  if (col_count_nrequests_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nrequests_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nrequests_ps.field_3.uint64_val =
                                                         col_count_nrequests_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nfills_ps.field_3.uint64_val == 0 ||
                                                      uptime == 0) {
                                                    col_count_nfills_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nfills_ps.field_3.uint64_val =
                                                         col_count_nfills_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nflushes_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nflushes_ps.field_3.uint64_val = 0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    auVar13._8_8_ = 0;
                                                    auVar13._0_8_ =
                                                         col_count_nflushes_ps.field_3.uint64_val;
                                                    col_count_nflushes_ps.field_3.uint64_val =
                                                         SUB168(auVar13 / (ZEXT816(0) *
                                                                           ZEXT816(0x44b82fa09b5a53)
                                                                           >> 0x4b &
                                                                          (undefined1  [16])
                                                                          0x1fffffffffffff),0);
                                                  }
                                                  peVar26 = peVar17;
                                                  if (emitter->output == emitter_output_table) {
                                                    do {
                                                      if (peVar26 == (emitter_col_t *)0x0) break;
                                                      emitter_print_value(emitter,peVar26->justify,
                                                                          peVar26->width,
                                                                          peVar26->type,
                                                                          &peVar26->field_3);
                                                      peVar26 = (peVar26->link).qre_next;
                                                    } while (peVar26 != peVar17);
                                                    emitter_table_printf(emitter,"\n");
                                                    bVar32 = emitter->output == emitter_output_table
                                                    ;
                                                  }
                                                  else {
                                                    bVar32 = false;
                                                  }
                                                  local_8d8 = 0x1500000000;
                                                  local_8d0 = 8;
                                                  local_8c8 = "";
                                                  local_590 = (emitter_justify_t *)&local_8d8;
                                                  local_598 = (emitter_justify_t *)&local_8d8;
                                                  local_8c0 = &local_5b0;
                                                  local_8b8 = &local_5b0;
                                                  local_5b0 = 0x1000000001;
                                                  local_5a8 = 8;
                                                  local_5a0 = "";
                                                  if (bVar32) {
                                                    peVar23 = (emitter_justify_t *)&local_8d8;
                                                    do {
                                                      emitter_print_value(emitter,*peVar23,
                                                                          peVar23[1],peVar23[2],
                                                                          peVar23 + 4);
                                                      peVar23 = *(emitter_justify_t **)(peVar23 + 6)
                                                      ;
                                                      if (peVar23 == (emitter_justify_t *)&local_8d8
                                                         ) break;
                                                    } while (peVar23 != (emitter_justify_t *)0x0);
                                                    emitter_table_printf(emitter,"\n");
                                                    local_5a8 = 5;
                                                    local_8c8 = "active:";
                                                    local_5a0 = (char *)(page * pactive);
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                  }
                                                  else {
                                                    local_5a8 = 5;
                                                    local_8c8 = "active:";
                                                    local_5a0 = (char *)(page * pactive);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.mapped",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,&mapped,
                                                                             &sz_1,(void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","mapped");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,mapped);
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "mapped:";
                                                    local_5a0 = (char *)mapped;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.retained",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,&retained,
                                                                             &sz_1,(void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","retained");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,retained)
                                                        ;
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "retained:";
                                                    local_5a0 = (char *)retained;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.base",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,&base,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","base");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,base);
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "base:";
                                                    local_5a0 = (char *)base;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.internal",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,&internal,
                                                                             &sz_1,(void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","internal");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,internal)
                                                        ;
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "internal:";
                                                    local_5a0 = (char *)internal;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.metadata_thp",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &metadata_thp,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "metadata_thp");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       metadata_thp);
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "metadata_thp:";
                                                    local_5a0 = (char *)metadata_thp;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.tcache_bytes",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &tcache_bytes,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "tcache_bytes");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       tcache_bytes);
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "tcache_bytes:";
                                                    local_5a0 = (char *)tcache_bytes;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.resident",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,&resident,
                                                                             &sz_1,(void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","resident");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,resident)
                                                        ;
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "resident:";
                                                    local_5a0 = (char *)resident;
                                                    if (eVar20 == emitter_output_table) {
                                                      peVar23 = (emitter_justify_t *)&local_8d8;
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extent_avail",&sz,&miblen);
                                                  if (iVar19 == 0) {
                                                    local_758[0] = aVar14;
                                                    iVar19 = je_mallctlbymib(&sz,miblen,
                                                                             &extent_avail,&sz_1,
                                                                             (void *)0x0,0);
                                                    if (iVar19 != 0) goto LAB_00147faf;
                                                    eVar20 = emitter->output;
                                                    if (eVar20 == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        pcVar28 = ",";
                                                        if (emitter->item_at_depth == false) {
                                                          pcVar28 = "";
                                                        }
                                                        emitter_printf(emitter,"%s\n",pcVar28);
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar21 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          iVar19 = 1;
                                                          if (1 < iVar21) {
                                                            iVar19 = iVar21;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "extent_avail");
                                                      emitter->emitted_key = true;
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       extent_avail);
                                                        emitter->item_at_depth = true;
                                                        eVar20 = emitter->output;
                                                      }
                                                    }
                                                    local_8c8 = "extent_avail:";
                                                    local_5a0 = (char *)extent_avail;
                                                    peVar23 = (emitter_justify_t *)&local_8d8;
                                                    if (eVar20 == emitter_output_table) {
                                                      do {
                                                        emitter_print_value(emitter,*peVar23,
                                                                            peVar23[1],peVar23[2],
                                                                            peVar23 + 4);
                                                        peVar23 = *(emitter_justify_t **)
                                                                   (peVar23 + 6);
                                                        if (peVar23 ==
                                                            (emitter_justify_t *)&local_8d8) break;
                                                      } while (peVar23 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf(emitter,"\n");
                                                    }
                                                    uVar24 = uptime;
                                                    if ((char)uptime_s_5 != '\0') {
                                                      row.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (emitter_col_t *)0x0;
                                                      mutex_stats_init_cols
                                                                (&row,"",&col_name,
                                                                 (emitter_col_t *)&sz,&local_468);
                                                      eVar20 = emitter->output;
                                                      local_9a8 = uVar24;
                                                      if (eVar20 == emitter_output_json) {
                                                        if (emitter->emitted_key == true) {
                                                          emitter->emitted_key = false;
                                                        }
                                                        else {
                                                          pcVar28 = ",";
                                                          if (emitter->item_at_depth == false) {
                                                            pcVar28 = "";
                                                          }
                                                          emitter_printf(emitter,"%s\n",pcVar28);
                                                          pcVar28 = "\t";
                                                          if (emitter->output != emitter_output_json
                                                             ) {
                                                            pcVar28 = " ";
                                                          }
                                                          if (0 < emitter->nesting_depth) {
                                                            iVar21 = emitter->nesting_depth <<
                                                                     (emitter->output !=
                                                                     emitter_output_json);
                                                            iVar19 = 1;
                                                            if (1 < iVar21) {
                                                              iVar19 = iVar21;
                                                            }
                                                            do {
                                                              emitter_printf(emitter,"%s",pcVar28);
                                                              iVar19 = iVar19 + -1;
                                                            } while (iVar19 != 0);
                                                          }
                                                        }
                                                        emitter_printf(emitter,"\"%s\": ","mutexes")
                                                        ;
                                                        uVar24 = local_9a8;
                                                        emitter->emitted_key = true;
                                                        eVar20 = emitter->output;
                                                        if (eVar20 == emitter_output_json) {
                                                          emitter->emitted_key = false;
                                                          emitter_printf(emitter,"{");
                                                          emitter->nesting_depth =
                                                               emitter->nesting_depth + 1;
                                                          emitter->item_at_depth = false;
                                                          eVar20 = emitter->output;
                                                        }
                                                      }
                                                      if (eVar20 == emitter_output_table) {
                                                        eVar29.cols.qlh_first = row.cols.qlh_first;
                                                        if (row.cols.qlh_first !=
                                                            (emitter_col_t *)0x0) {
                                                          do {
                                                            emitter_print_value(emitter,((
                                                  emitter_col_t *)eVar29.cols.qlh_first)->justify,
                                                  ((emitter_col_t *)eVar29.cols.qlh_first)->width,
                                                  ((emitter_col_t *)eVar29.cols.qlh_first)->type,
                                                  &((emitter_col_t *)eVar29.cols.qlh_first)->field_3
                                                  );
                                                  eVar29.cols.qlh_first =
                                                       (anon_struct_8_1_803fbc3e_for_cols)
                                                       (((emitter_col_t *)eVar29.cols.qlh_first)->
                                                       link).qre_next;
                                                  if (eVar29.cols.qlh_first == (emitter_col_t *)0x0)
                                                  break;
                                                  } while (eVar29.cols.qlh_first !=
                                                           row.cols.qlh_first);
                                                  }
                                                  emitter_table_printf(emitter,"\n");
                                                  uVar24 = local_9a8;
                                                  }
                                                  uVar22 = uVar24 / 1000000000;
                                                  lVar27 = 0;
                                                  do {
                                                    aVar25 = *(
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (arena_mutex_names + lVar27);
                                                  if (emitter->output == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar28 = "";
                                                      if (emitter->item_at_depth != false) {
                                                        pcVar28 = ",";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar28);
                                                      pcVar28 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar28 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar19 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        if (iVar19 < 2) {
                                                          iVar19 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar28);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"\"%s\": ",
                                                                   aVar25.uint64_val);
                                                    emitter->emitted_key = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      emitter->emitted_key = false;
                                                      emitter_printf(emitter,"{");
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + 1;
                                                      emitter->item_at_depth = false;
                                                    }
                                                  }
                                                  local_760 = emitter_type_uint64;
                                                  col_name.field_3 = aVar25;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) {
LAB_00147fc0:
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = (char *)&miblen;
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_758
                                                                           ,&sz_40,(void *)0x0,0);
                                                  uVar16 = local_9a8;
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_738 = 4;
                                                  local_730 = local_758[0];
                                                  if (local_9a8 == 0) {
                                                    local_730.uint64_val = 0;
                                                  }
                                                  if ((char *)local_758[0].uint64_val != (char *)0x0
                                                      && 999999999 < local_9a8) {
                                                    local_730.uint64_val =
                                                         local_758[0].uint64_val / uVar22;
                                                  }
                                                  local_710 = 4;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_708
                                                                           ,&sz_40,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_6e8 = 4;
                                                  local_6e0 = local_708[0];
                                                  if (uVar16 == 0) {
                                                    local_6e0 = 0;
                                                  }
                                                  if (local_708[0] != 0 && 999999999 < uVar16) {
                                                    local_6e0 = local_708[0] / uVar22;
                                                  }
                                                  local_6c0 = 4;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_6b8
                                                                           ,&sz_40,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_698 = 4;
                                                  local_690 = local_6b8[0];
                                                  if (uVar16 == 0) {
                                                    local_690 = 0;
                                                  }
                                                  if (local_6b8[0] != 0 && 999999999 < uVar16) {
                                                    local_690 = local_6b8[0] / uVar22;
                                                  }
                                                  local_670 = 4;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_668
                                                                           ,&sz_40,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_648 = 4;
                                                  local_640 = local_668[0];
                                                  if (uVar16 == 0) {
                                                    local_640 = 0;
                                                  }
                                                  if (local_668[0] != 0 && 999999999 < uVar16) {
                                                    local_640 = local_668[0] / uVar22;
                                                  }
                                                  local_620 = 4;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_618
                                                                           ,&sz_40,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_5f8 = 4;
                                                  local_5f0 = local_618[0];
                                                  if (uVar16 == 0) {
                                                    local_5f0 = 0;
                                                  }
                                                  if (local_618[0] != 0 && 999999999 < uVar16) {
                                                    local_5f0 = local_618[0] / uVar22;
                                                  }
                                                  local_5d0 = 4;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 8;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,local_5c8
                                                                           ,&sz_40,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_468.type = emitter_type_uint32;
                                                  malloc_snprintf((char *)&miblen,0x80,
                                                                  "stats.%s.%s.%s",
                                                                  "arenas.0.mutexes");
                                                  miblen_40 = 7;
                                                  sz_40 = 4;
                                                  iVar19 = je_mallctlnametomib((char *)&miblen,&sz_1
                                                                               ,&miblen_40);
                                                  if (iVar19 != 0) goto LAB_00147fc0;
                                                  local_9e8 = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz_1,miblen_40,
                                                                           &local_468.field_3,&sz_40
                                                                           ,(void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  mutex_stats_emit(emitter,&row,(emitter_col_t *)&sz
                                                                   ,&local_468);
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    emitter_printf(emitter,"\n");
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar19 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      if (iVar19 < 2) {
                                                        iVar19 = 1;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  lVar27 = lVar27 + 1;
                                                  } while (lVar27 != 9);
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    emitter_printf(emitter,"\n");
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  }
                                                  if ((char)local_834 != '\0') {
                                                    stats_arena_bins_print
                                                              (emitter,(_Bool)(char)uptime_s_5,
                                                               local_83c,uptime);
                                                  }
                                                  if ((char)local_830 == '\0') {
LAB_00147025:
                                                    col_name.link.qre_prev =
                                                         (emitter_col_t *)&miblen;
                                                    if ((char)local_838 != '\0') {
                                                      miblen = 0x1400000001;
                                                      local_990 = emitter_type_size;
                                                      local_9f0 = emitter_type_title;
                                                      local_9e8.str_val = "size";
                                                      local_980 = &col_name;
                                                      col_name.justify = emitter_justify_right;
                                                      col_name.width = 4;
                                                      col_name.type = emitter_type_unsigned;
                                                      local_9e0 = &local_468;
                                                      peVar26 = (emitter_col_t *)&sz_1;
                                                      local_468.justify = emitter_justify_right;
                                                      local_468.width = 4;
                                                      local_468.type = emitter_type_title;
                                                      local_468.field_3.str_val = "ind";
                                                      col_name.link.qre_next =
                                                           (emitter_col_t *)&miblen_40;
                                                      miblen_40 = 0xd00000001;
                                                      local_8f8 = emitter_type_size;
                                                      local_468.link.qre_next =
                                                           (emitter_col_t *)&sz_40;
                                                      sz_40 = 0xd00000001;
                                                      local_820 = emitter_type_title;
                                                      local_818.str_val = "ndirty";
                                                      local_8e8 = (emitter_col_t *)&row;
                                                      row.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (emitter_col_t *)0xd00000001;
                                                      local_810 = &local_58;
                                                      local_58.justify = emitter_justify_right;
                                                      local_58.width = 0xd;
                                                      local_58.type = emitter_type_title;
                                                      local_58.field_3.str_val = "dirty";
                                                      local_1c0.link.qre_prev = &local_198;
                                                      local_198.justify = emitter_justify_right;
                                                      local_198.width = 0xd;
                                                      local_198.type = emitter_type_size;
                                                      local_a8.link.qre_prev = &local_80;
                                                      local_80.justify = emitter_justify_right;
                                                      local_80.width = 0xd;
                                                      local_80.type = emitter_type_title;
                                                      local_80.field_3.str_val = "nmuzzy";
                                                      local_1e8.link.qre_prev = &local_1c0;
                                                      local_1c0.justify = emitter_justify_right;
                                                      local_1c0.width = 0xd;
                                                      local_1c0.type = emitter_type_size;
                                                      local_d0.link.qre_prev = &local_a8;
                                                      local_a8.justify = emitter_justify_right;
                                                      local_a8.width = 0xd;
                                                      local_a8.type = emitter_type_title;
                                                      local_a8.field_3.str_val = "muzzy";
                                                      local_210.link.qre_prev = &local_1e8;
                                                      local_1e8.justify = emitter_justify_right;
                                                      local_1e8.width = 0xd;
                                                      local_1e8.type = emitter_type_size;
                                                      local_f8.link.qre_prev = &local_d0;
                                                      local_d0.justify = emitter_justify_right;
                                                      local_d0.width = 0xd;
                                                      local_d0.type = emitter_type_title;
                                                      local_d0.field_3.str_val = "nretained";
                                                      local_238.link.qre_prev = &local_210;
                                                      local_210.justify = emitter_justify_right;
                                                      local_210.width = 0xd;
                                                      local_210.type = emitter_type_size;
                                                      local_120.link.qre_prev = &local_f8;
                                                      local_f8.justify = emitter_justify_right;
                                                      local_f8.width = 0xd;
                                                      local_f8.type = emitter_type_title;
                                                      local_f8.field_3.str_val = "retained";
                                                      local_260.link.qre_prev = &local_238;
                                                      local_238.justify = emitter_justify_right;
                                                      local_238.width = 0xd;
                                                      local_238.type = emitter_type_size;
                                                      local_148.link.qre_prev = &local_120;
                                                      local_120.justify = emitter_justify_right;
                                                      local_120.width = 0xd;
                                                      local_120.type = emitter_type_title;
                                                      local_120.field_3.str_val = "ntotal";
                                                      local_978 = &local_260;
                                                      local_260.justify = emitter_justify_right;
                                                      local_260.width = 0xd;
                                                      local_260.type = emitter_type_size;
                                                      local_9d8 = &local_148;
                                                      local_148.justify = emitter_justify_right;
                                                      local_148.width = 0xd;
                                                      local_148.type = emitter_type_title;
                                                      local_148.field_3.str_val = "total";
                                                      sz_1 = 0xc00000001;
                                                      local_8e0 = local_980;
                                                      local_808 = local_9e0;
                                                      local_468.link.qre_prev = peVar26;
                                                      local_260.link.qre_next =
                                                           col_name.link.qre_prev;
                                                      local_238.link.qre_next = local_978;
                                                      local_210.link.qre_next =
                                                           local_260.link.qre_prev;
                                                      local_1e8.link.qre_next =
                                                           local_238.link.qre_prev;
                                                      local_1c0.link.qre_next =
                                                           local_210.link.qre_prev;
                                                      local_198.link.qre_next =
                                                           local_1e8.link.qre_prev;
                                                      local_198.link.qre_prev = local_8e8;
                                                      local_148.link.qre_next = peVar26;
                                                      local_120.link.qre_next = local_9d8;
                                                      local_f8.link.qre_next =
                                                           local_148.link.qre_prev;
                                                      local_d0.link.qre_next =
                                                           local_120.link.qre_prev;
                                                      local_a8.link.qre_next =
                                                           local_f8.link.qre_prev;
                                                      local_80.link.qre_next =
                                                           local_d0.link.qre_prev;
                                                      local_80.link.qre_prev = local_810;
                                                      local_58.link.qre_next =
                                                           local_a8.link.qre_prev;
                                                      local_58.link.qre_prev =
                                                           local_468.link.qre_next;
                                                      emitter_table_printf(emitter,"extents:");
                                                      eVar20 = emitter->output;
                                                      if (eVar20 == emitter_output_table) {
                                                        do {
                                                          emitter_print_value(emitter,peVar26->
                                                  justify,peVar26->width,peVar26->type,
                                                  &peVar26->field_3);
                                                  peVar26 = (peVar26->link).qre_next;
                                                  if (peVar26 == (emitter_col_t *)&sz_1) break;
                                                  } while (peVar26 != (emitter_col_t *)0x0);
                                                  emitter_table_printf(emitter,"\n");
                                                  eVar20 = emitter->output;
                                                  }
                                                  if (eVar20 == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar28 = ",";
                                                      if (emitter->item_at_depth == false) {
                                                        pcVar28 = "";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar28);
                                                      pcVar28 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar28 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar21 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        iVar19 = 1;
                                                        if (1 < iVar21) {
                                                          iVar19 = iVar21;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar28);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"\"%s\": ","extents");
                                                    emitter->emitted_key = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      emitter->emitted_key = false;
                                                      emitter_printf(emitter,"[");
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + 1;
                                                      emitter->item_at_depth = false;
                                                    }
                                                  }
                                                  uptime_s = 0;
                                                  uVar22 = 0;
                                                  do {
                                                    nmuzzy = 7;
                                                    nretained = 8;
                                                    iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.ndirty",&sz,&nmuzzy);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extents.0.ndirty";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,nmuzzy,&ndirty,
                                                                           &nretained,(void *)0x0,0)
                                                  ;
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  nretained = 7;
                                                  dirty_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.nmuzzy",&sz,&nretained);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extents.0.nmuzzy";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,nretained,&nmuzzy,
                                                                           &dirty_bytes,(void *)0x0,
                                                                           0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  dirty_bytes = 7;
                                                  muzzy_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.nretained",&sz,
                                                  &dirty_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extents.0.nretained";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,dirty_bytes,
                                                                           &nretained,&muzzy_bytes,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  muzzy_bytes = 7;
                                                  retained_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.dirty_bytes",&sz,
                                                  &muzzy_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extents.0.dirty_bytes";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,muzzy_bytes,
                                                                           &dirty_bytes,
                                                                           &retained_bytes,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  retained_bytes = 7;
                                                  miblen_14 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.muzzy_bytes",&sz,
                                                  &retained_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extents.0.muzzy_bytes";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,retained_bytes,
                                                                           &muzzy_bytes,&miblen_14,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  miblen_14 = 7;
                                                  _nbins = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.extents.0.retained_bytes",&sz,
                                                  &miblen_14);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = 
                                                  "stats.arenas.0.extents.0.retained_bytes";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_748.uint64_val = uptime_s;
                                                  local_758[0] = aVar14;
                                                  iVar19 = je_mallctlbymib(&sz,miblen_14,
                                                                           &retained_bytes,
                                                                           (size_t *)&nbins,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  pcVar30 = (char *)(muzzy_bytes + dirty_bytes +
                                                                    retained_bytes);
                                                  pcVar28 = (char *)(nmuzzy + ndirty + nretained);
                                                  local_9a8 = CONCAT71((int7)(CONCAT44(
                                                  extraout_var_00,iVar19) >> 8),
                                                  pcVar28 == (char *)0x0);
                                                  if ((~(byte)uVar22 & 1) == 0 &&
                                                      pcVar28 != (char *)0x0) {
                                                    emitter_table_printf
                                                              (emitter,"                     ---\n")
                                                    ;
                                                  }
                                                  if (emitter->output == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar31 = "";
                                                      if (emitter->item_at_depth != false) {
                                                        pcVar31 = ",";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar31);
                                                      pcVar31 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar31 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar19 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        if (iVar19 < 2) {
                                                          iVar19 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar31);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"{");
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + 1;
                                                    emitter->item_at_depth = false;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        emitter_printf(emitter,"%s\n","");
                                                        pcVar31 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar31 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar19 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          if (iVar19 < 2) {
                                                            iVar19 = 1;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar31);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ","ndirty");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,ndirty);
                                                        emitter->item_at_depth = true;
                                                        if (emitter->output == emitter_output_json)
                                                        {
                                                          if (emitter->emitted_key == true) {
                                                            emitter->emitted_key = false;
                                                          }
                                                          else {
                                                            emitter_printf(emitter,"%s\n",",");
                                                            pcVar31 = "\t";
                                                            if (emitter->output !=
                                                                emitter_output_json) {
                                                              pcVar31 = " ";
                                                            }
                                                            if (0 < emitter->nesting_depth) {
                                                              iVar19 = emitter->nesting_depth <<
                                                                       (emitter->output !=
                                                                       emitter_output_json);
                                                              if (iVar19 < 2) {
                                                                iVar19 = 1;
                                                              }
                                                              do {
                                                                emitter_printf(emitter,"%s",pcVar31)
                                                                ;
                                                                iVar19 = iVar19 + -1;
                                                              } while (iVar19 != 0);
                                                            }
                                                          }
                                                          emitter_printf(emitter,"\"%s\": ","nmuzzy"
                                                                        );
                                                          emitter->emitted_key = true;
                                                          if (emitter->output == emitter_output_json
                                                             ) {
                                                            emitter->emitted_key = false;
                                                            malloc_snprintf((char *)&sz,10,"%%%s",
                                                                            "zu");
                                                            emitter_printf(emitter,(char *)&sz,
                                                                           nmuzzy);
                                                            emitter->item_at_depth = true;
                                                            if (emitter->output ==
                                                                emitter_output_json) {
                                                              if (emitter->emitted_key == true) {
                                                                emitter->emitted_key = false;
                                                              }
                                                              else {
                                                                emitter_printf(emitter,"%s\n",",");
                                                                pcVar31 = "\t";
                                                                if (emitter->output !=
                                                                    emitter_output_json) {
                                                                  pcVar31 = " ";
                                                                }
                                                                if (0 < emitter->nesting_depth) {
                                                                  iVar19 = emitter->nesting_depth <<
                                                                           (emitter->output !=
                                                                           emitter_output_json);
                                                                  if (iVar19 < 2) {
                                                                    iVar19 = 1;
                                                                  }
                                                                  do {
                                                                    emitter_printf(emitter,"%s",
                                                                                   pcVar31);
                                                                    iVar19 = iVar19 + -1;
                                                                  } while (iVar19 != 0);
                                                                }
                                                              }
                                                              emitter_printf(emitter,"\"%s\": ",
                                                                             "nretained");
                                                              emitter->emitted_key = true;
                                                              if (emitter->output ==
                                                                  emitter_output_json) {
                                                                emitter->emitted_key = false;
                                                                malloc_snprintf((char *)&sz,10,
                                                                                "%%%s","zu");
                                                                emitter_printf(emitter,(char *)&sz,
                                                                               nretained);
                                                                emitter->item_at_depth = true;
                                                                if (emitter->output ==
                                                                    emitter_output_json) {
                                                                  if (emitter->emitted_key == true)
                                                                  {
                                                                    emitter->emitted_key = false;
                                                                  }
                                                                  else {
                                                                    emitter_printf(emitter,"%s\n",
                                                                                   ",");
                                                                    pcVar31 = "\t";
                                                                    if (emitter->output !=
                                                                        emitter_output_json) {
                                                                      pcVar31 = " ";
                                                                    }
                                                                    if (0 < emitter->nesting_depth)
                                                                    {
                                                                      iVar19 = emitter->
                                                  nesting_depth <<
                                                  (emitter->output != emitter_output_json);
                                                  if (iVar19 < 2) {
                                                    iVar19 = 1;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar31);
                                                    iVar19 = iVar19 + -1;
                                                  } while (iVar19 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"\"%s\": ","dirty_bytes");
                                                  emitter->emitted_key = true;
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->emitted_key = false;
                                                    malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                    emitter_printf(emitter,(char *)&sz,dirty_bytes);
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        emitter_printf(emitter,"%s\n",",");
                                                        pcVar31 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar31 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar19 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          if (iVar19 < 2) {
                                                            iVar19 = 1;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar31);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "muzzy_bytes");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       muzzy_bytes);
                                                        emitter->item_at_depth = true;
                                                        if (emitter->output == emitter_output_json)
                                                        {
                                                          if (emitter->emitted_key == true) {
                                                            emitter->emitted_key = false;
                                                          }
                                                          else {
                                                            emitter_printf(emitter,"%s\n",",");
                                                            pcVar31 = "\t";
                                                            if (emitter->output !=
                                                                emitter_output_json) {
                                                              pcVar31 = " ";
                                                            }
                                                            if (0 < emitter->nesting_depth) {
                                                              iVar19 = emitter->nesting_depth <<
                                                                       (emitter->output !=
                                                                       emitter_output_json);
                                                              if (iVar19 < 2) {
                                                                iVar19 = 1;
                                                              }
                                                              do {
                                                                emitter_printf(emitter,"%s",pcVar31)
                                                                ;
                                                                iVar19 = iVar19 + -1;
                                                              } while (iVar19 != 0);
                                                            }
                                                          }
                                                          emitter_printf(emitter,"\"%s\": ",
                                                                         "retained_bytes");
                                                          emitter->emitted_key = true;
                                                          if (emitter->output == emitter_output_json
                                                             ) {
                                                            emitter->emitted_key = false;
                                                            malloc_snprintf((char *)&sz,10,"%%%s",
                                                                            "zu");
                                                            emitter_printf(emitter,(char *)&sz,
                                                                           retained_bytes);
                                                            emitter->item_at_depth = true;
                                                            if (emitter->output ==
                                                                emitter_output_json) {
                                                              emitter->nesting_depth =
                                                                   emitter->nesting_depth + -1;
                                                              emitter_printf(emitter,"\n");
                                                              pcVar31 = "\t";
                                                              if (emitter->output !=
                                                                  emitter_output_json) {
                                                                pcVar31 = " ";
                                                              }
                                                              if (0 < emitter->nesting_depth) {
                                                                iVar19 = emitter->nesting_depth <<
                                                                         (emitter->output !=
                                                                         emitter_output_json);
                                                                if (iVar19 < 2) {
                                                                  iVar19 = 1;
                                                                }
                                                                do {
                                                                  emitter_printf(emitter,"%s",
                                                                                 pcVar31);
                                                                  iVar19 = iVar19 + -1;
                                                                } while (iVar19 != 0);
                                                              }
                                                              emitter_printf(emitter,"}");
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  local_988 = *(
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (sz_pind2sz_tab + uptime_s);
                                                  col_name.field_3.uint64_val = uptime_s;
                                                  local_8f0.size_val = ndirty;
                                                  local_198.field_3.size_val = nmuzzy;
                                                  local_1c0.field_3.size_val = muzzy_bytes;
                                                  local_1e8.field_3.size_val = nretained;
                                                  local_210.field_3.size_val = retained_bytes;
                                                  local_238.field_3.str_val = pcVar28;
                                                  local_260.field_3.str_val = pcVar30;
                                                  if ((pcVar28 != (char *)0x0) &&
                                                     (peVar23 = (emitter_justify_t *)&miblen,
                                                     emitter->output == emitter_output_table)) {
                                                    do {
                                                      emitter_print_value(emitter,*peVar23,
                                                                          peVar23[1],peVar23[2],
                                                                          peVar23 + 4);
                                                      peVar23 = *(emitter_justify_t **)(peVar23 + 6)
                                                      ;
                                                      if (peVar23 == (emitter_justify_t *)&miblen)
                                                      break;
                                                    } while (peVar23 != (emitter_justify_t *)0x0);
                                                    emitter_table_printf(emitter,"\n");
                                                  }
                                                  uptime_s = uptime_s + 1;
                                                  uVar22 = local_9a8;
                                                  } while (uptime_s != 199);
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    emitter_printf(emitter,"\n");
                                                    pcVar30 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar30 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar30);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                    emitter_printf(emitter,"]");
                                                  }
                                                  if (pcVar28 == (char *)0x0) {
                                                    emitter_table_printf
                                                              (emitter,"                     ---\n")
                                                    ;
                                                  }
                                                  }
                                                  return;
                                                  }
                                                  sz = 4;
                                                  iVar19 = je_mallctl("arenas.nbins",&nbins,&sz,
                                                                      (void *)0x0,0);
                                                  if (iVar19 == 0) {
                                                    sz = 4;
                                                    iVar19 = je_mallctl("arenas.nlextents",
                                                                        &nlextents,&sz,(void *)0x0,0
                                                                       );
                                                    if (iVar19 == 0) {
                                                      col_name.link.qre_prev =
                                                           (emitter_col_t *)&miblen;
                                                      miblen = 0x1400000001;
                                                      local_990 = emitter_type_size;
                                                      local_9f0 = emitter_type_title;
                                                      local_9e8.str_val = "size";
                                                      local_980 = &col_name;
                                                      col_name.justify = emitter_justify_right;
                                                      col_name.width = 4;
                                                      col_name.type = emitter_type_unsigned;
                                                      local_9e0 = &local_468;
                                                      local_468.justify = emitter_justify_right;
                                                      local_468.width = 4;
                                                      local_468.type = emitter_type_title;
                                                      local_468.field_3.str_val = "ind";
                                                      col_name.link.qre_next =
                                                           (emitter_col_t *)&miblen_40;
                                                      miblen_40 = 0xd00000001;
                                                      local_8f8 = emitter_type_size;
                                                      local_468.link.qre_next =
                                                           (emitter_col_t *)&sz_40;
                                                      sz_40 = 0xd00000001;
                                                      local_820 = emitter_type_title;
                                                      local_818.str_val = "allocated";
                                                      local_8e8 = (emitter_col_t *)&row;
                                                      row.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (emitter_col_t *)0xd00000001;
                                                      local_810 = &local_58;
                                                      local_58.justify = emitter_justify_right;
                                                      local_58.width = 0xd;
                                                      local_58.type = emitter_type_title;
                                                      local_58.field_3.str_val = "nmalloc";
                                                      local_1c0.link.qre_prev = &local_198;
                                                      local_198.justify = emitter_justify_right;
                                                      local_198.width = 8;
                                                      local_198.type = emitter_type_uint64;
                                                      local_a8.link.qre_prev = &local_80;
                                                      local_80.justify = emitter_justify_right;
                                                      local_80.width = 8;
                                                      local_80.type = emitter_type_title;
                                                      local_80.field_3.str_val = "(#/sec)";
                                                      local_1e8.link.qre_prev = &local_1c0;
                                                      local_1c0.justify = emitter_justify_right;
                                                      local_1c0.width = 0xd;
                                                      local_1c0.type = emitter_type_uint64;
                                                      local_d0.link.qre_prev = &local_a8;
                                                      local_a8.justify = emitter_justify_right;
                                                      local_a8.width = 0xd;
                                                      local_a8.type = emitter_type_title;
                                                      local_a8.field_3.str_val = "ndalloc";
                                                      local_210.link.qre_prev = &local_1e8;
                                                      local_1e8.justify = emitter_justify_right;
                                                      local_1e8.width = 8;
                                                      local_1e8.type = emitter_type_uint64;
                                                      local_f8.link.qre_prev = &local_d0;
                                                      local_d0.justify = emitter_justify_right;
                                                      local_d0.width = 8;
                                                      local_d0.type = emitter_type_title;
                                                      local_d0.field_3.str_val = "(#/sec)";
                                                      local_238.link.qre_prev = &local_210;
                                                      local_210.justify = emitter_justify_right;
                                                      local_210.width = 0xd;
                                                      local_210.type = emitter_type_uint64;
                                                      local_120.link.qre_prev = &local_f8;
                                                      local_f8.justify = emitter_justify_right;
                                                      local_f8.width = 0xd;
                                                      local_f8.type = emitter_type_title;
                                                      local_f8.field_3.str_val = "nrequests";
                                                      local_260.link.qre_prev = &local_238;
                                                      local_238.justify = emitter_justify_right;
                                                      local_238.width = 8;
                                                      local_238.type = emitter_type_uint64;
                                                      local_148.link.qre_prev = &local_120;
                                                      local_120.justify = emitter_justify_right;
                                                      local_120.width = 8;
                                                      local_120.type = emitter_type_title;
                                                      local_120.field_3.str_val = "(#/sec)";
                                                      local_978 = &local_260;
                                                      local_260.justify = emitter_justify_right;
                                                      local_260.width = 0xd;
                                                      local_260.type = emitter_type_size;
                                                      local_9d8 = &local_148;
                                                      local_148.justify = emitter_justify_right;
                                                      local_148.width = 0xd;
                                                      local_148.type = emitter_type_title;
                                                      local_148.field_3.str_val = "curlextents";
                                                      sz_1 = 0xe00000001;
                                                      local_8e0 = local_980;
                                                      local_808 = local_9e0;
                                                      local_468.link.qre_prev =
                                                           (emitter_col_t *)&sz_1;
                                                      local_260.link.qre_next =
                                                           col_name.link.qre_prev;
                                                      local_238.link.qre_next = local_978;
                                                      local_210.link.qre_next =
                                                           local_260.link.qre_prev;
                                                      local_1e8.link.qre_next =
                                                           local_238.link.qre_prev;
                                                      local_1c0.link.qre_next =
                                                           local_210.link.qre_prev;
                                                      local_198.link.qre_next =
                                                           local_1e8.link.qre_prev;
                                                      local_198.link.qre_prev = local_8e8;
                                                      local_148.link.qre_next =
                                                           (emitter_col_t *)&sz_1;
                                                      local_120.link.qre_next = local_9d8;
                                                      local_f8.link.qre_next =
                                                           local_148.link.qre_prev;
                                                      local_d0.link.qre_next =
                                                           local_120.link.qre_prev;
                                                      local_a8.link.qre_next =
                                                           local_f8.link.qre_prev;
                                                      local_80.link.qre_next =
                                                           local_d0.link.qre_prev;
                                                      local_80.link.qre_prev = local_810;
                                                      local_58.link.qre_next =
                                                           local_a8.link.qre_prev;
                                                      local_58.link.qre_prev =
                                                           local_468.link.qre_next;
                                                      emitter_table_printf(emitter,"large:");
                                                      eVar20 = emitter->output;
                                                      peVar26 = (emitter_col_t *)&sz_1;
                                                      if (eVar20 == emitter_output_table) {
                                                        do {
                                                          emitter_print_value(emitter,peVar26->
                                                  justify,peVar26->width,peVar26->type,
                                                  &peVar26->field_3);
                                                  peVar26 = (peVar26->link).qre_next;
                                                  if (peVar26 == (emitter_col_t *)&sz_1) break;
                                                  } while (peVar26 != (emitter_col_t *)0x0);
                                                  emitter_table_printf(emitter,"\n");
                                                  eVar20 = emitter->output;
                                                  }
                                                  if (eVar20 == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar28 = ",";
                                                      if (emitter->item_at_depth == false) {
                                                        pcVar28 = "";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar28);
                                                      pcVar28 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar28 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar21 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        iVar19 = 1;
                                                        if (1 < iVar21) {
                                                          iVar19 = iVar21;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar28);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"\"%s\": ","lextents");
                                                    emitter->emitted_key = true;
                                                    if (emitter->output == emitter_output_json) {
                                                      emitter->emitted_key = false;
                                                      emitter_printf(emitter,"[");
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + 1;
                                                      emitter->item_at_depth = false;
                                                    }
                                                  }
                                                  if (nlextents == 0) {
                                                    cVar18 = '\0';
                                                  }
                                                  else {
                                                    uptime_s_5 = uptime / 1000000000;
                                                    aVar25.uint64_val = 0;
                                                    uVar22 = 0;
                                                    do {
                                                      nmuzzy = 7;
                                                      nretained = 8;
                                                      iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.lextents.0.nmalloc",&sz,&nmuzzy);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.lextents.0.nmalloc";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_758[0] = aVar14;
                                                  local_748 = aVar25;
                                                  iVar19 = je_mallctlbymib(&sz,nmuzzy,&ndirty,
                                                                           &nretained,(void *)0x0,0)
                                                  ;
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  nretained = 7;
                                                  dirty_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.lextents.0.ndalloc",&sz,&nretained
                                                  );
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.lextents.0.ndalloc";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_758[0] = aVar14;
                                                  local_748 = aVar25;
                                                  iVar19 = je_mallctlbymib(&sz,nretained,&nmuzzy,
                                                                           &dirty_bytes,(void *)0x0,
                                                                           0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  dirty_bytes = 7;
                                                  muzzy_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.lextents.0.nrequests",&sz,
                                                  &dirty_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.lextents.0.nrequests";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_758[0] = aVar14;
                                                  local_748 = aVar25;
                                                  iVar19 = je_mallctlbymib(&sz,dirty_bytes,
                                                                           &nretained,&muzzy_bytes,
                                                                           (void *)0x0,0);
                                                  sVar15 = nretained;
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  local_9a8 = CONCAT71((int7)(CONCAT44(extraout_var,
                                                                                       iVar19) >> 8)
                                                                       ,nretained == 0);
                                                  if ((~(byte)uVar22 & 1) == 0 && nretained != 0) {
                                                    emitter_table_printf
                                                              (emitter,"                     ---\n")
                                                    ;
                                                  }
                                                  muzzy_bytes = 7;
                                                  retained_bytes = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "arenas.lextent.0.size",&sz,&muzzy_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "arenas.lextent.0.size";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_758[0] = aVar25;
                                                  iVar19 = je_mallctlbymib(&sz,muzzy_bytes,
                                                                           &dirty_bytes,
                                                                           &retained_bytes,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  retained_bytes = 7;
                                                  miblen_14 = 8;
                                                  iVar19 = je_mallctlnametomib(
                                                  "stats.arenas.0.lextents.0.curlextents",&sz,
                                                  &retained_bytes);
                                                  if (iVar19 != 0) {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.lextents.0.curlextents";
                                                  goto LAB_00147fcf;
                                                  }
                                                  local_758[0] = aVar14;
                                                  local_748 = aVar25;
                                                  iVar19 = je_mallctlbymib(&sz,retained_bytes,
                                                                           &muzzy_bytes,&miblen_14,
                                                                           (void *)0x0,0);
                                                  if (iVar19 != 0) goto LAB_00147faf;
                                                  if (emitter->output == emitter_output_json) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      pcVar28 = "";
                                                      if (emitter->item_at_depth != false) {
                                                        pcVar28 = ",";
                                                      }
                                                      emitter_printf(emitter,"%s\n",pcVar28);
                                                      pcVar28 = "\t";
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar28 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar19 = emitter->nesting_depth <<
                                                                 (emitter->output !=
                                                                 emitter_output_json);
                                                        if (iVar19 < 2) {
                                                          iVar19 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar28);
                                                          iVar19 = iVar19 + -1;
                                                        } while (iVar19 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"{");
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + 1;
                                                    emitter->item_at_depth = false;
                                                    if (emitter->output == emitter_output_json) {
                                                      if (emitter->emitted_key == true) {
                                                        emitter->emitted_key = false;
                                                      }
                                                      else {
                                                        emitter_printf(emitter,"%s\n","");
                                                        pcVar28 = "\t";
                                                        if (emitter->output != emitter_output_json)
                                                        {
                                                          pcVar28 = " ";
                                                        }
                                                        if (0 < emitter->nesting_depth) {
                                                          iVar19 = emitter->nesting_depth <<
                                                                   (emitter->output !=
                                                                   emitter_output_json);
                                                          if (iVar19 < 2) {
                                                            iVar19 = 1;
                                                          }
                                                          do {
                                                            emitter_printf(emitter,"%s",pcVar28);
                                                            iVar19 = iVar19 + -1;
                                                          } while (iVar19 != 0);
                                                        }
                                                      }
                                                      emitter_printf(emitter,"\"%s\": ",
                                                                     "curlextents");
                                                      emitter->emitted_key = true;
                                                      if (emitter->output == emitter_output_json) {
                                                        emitter->emitted_key = false;
                                                        malloc_snprintf((char *)&sz,10,"%%%s","zu");
                                                        emitter_printf(emitter,(char *)&sz,
                                                                       muzzy_bytes);
                                                        emitter->item_at_depth = true;
                                                        if (emitter->output == emitter_output_json)
                                                        {
                                                          emitter->nesting_depth =
                                                               emitter->nesting_depth + -1;
                                                          emitter_printf(emitter,"\n");
                                                          pcVar28 = "\t";
                                                          if (emitter->output != emitter_output_json
                                                             ) {
                                                            pcVar28 = " ";
                                                          }
                                                          if (0 < emitter->nesting_depth) {
                                                            iVar19 = emitter->nesting_depth <<
                                                                     (emitter->output !=
                                                                     emitter_output_json);
                                                            if (iVar19 < 2) {
                                                              iVar19 = 1;
                                                            }
                                                            do {
                                                              emitter_printf(emitter,"%s",pcVar28);
                                                              iVar19 = iVar19 + -1;
                                                            } while (iVar19 != 0);
                                                          }
                                                          emitter_printf(emitter,"}");
                                                        }
                                                      }
                                                    }
                                                  }
                                                  local_988.size_val = dirty_bytes;
                                                  col_name.field_3.int_val = nbins + aVar25.int_val;
                                                  local_8f0.uint64_val = muzzy_bytes * dirty_bytes;
                                                  local_198.field_3.size_val = ndirty;
                                                  if (uptime == 0) {
                                                    local_198.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  if (ndirty != 0 && 999999999 < uptime) {
                                                    local_198.field_3.uint64_val =
                                                         ndirty / uptime_s_5;
                                                  }
                                                  local_1c0.field_3.size_val = nmuzzy;
                                                  local_1e8.field_3.size_val = nmuzzy;
                                                  if (uptime == 0) {
                                                    local_1e8.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  if (nmuzzy != 0 && 999999999 < uptime) {
                                                    local_1e8.field_3.uint64_val =
                                                         nmuzzy / uptime_s_5;
                                                  }
                                                  local_210.field_3.size_val = nretained;
                                                  local_238.field_3.size_val = nretained;
                                                  if (uptime == 0) {
                                                    local_238.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  if (nretained != 0 && 999999999 < uptime) {
                                                    local_238.field_3.uint64_val =
                                                         nretained / uptime_s_5;
                                                  }
                                                  local_260.field_3.size_val = muzzy_bytes;
                                                  if ((sVar15 != 0) &&
                                                     (peVar23 = (emitter_justify_t *)&miblen,
                                                     emitter->output == emitter_output_table)) {
                                                    do {
                                                      emitter_print_value(emitter,*peVar23,
                                                                          peVar23[1],peVar23[2],
                                                                          peVar23 + 4);
                                                      peVar23 = *(emitter_justify_t **)(peVar23 + 6)
                                                      ;
                                                      if (peVar23 == (emitter_justify_t *)&miblen)
                                                      break;
                                                    } while (peVar23 != (emitter_justify_t *)0x0);
                                                    emitter_table_printf(emitter,"\n");
                                                  }
                                                  aVar25.str_val = (char *)(aVar25.uint64_val + 1);
                                                  cVar18 = (char)local_9a8;
                                                  uVar22 = local_9a8;
                                                  } while (aVar25.uint64_val <
                                                           (char *)(ulong)nlextents);
                                                  }
                                                  if (emitter->output == emitter_output_json) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    emitter_printf(emitter,"\n");
                                                    pcVar28 = "\t";
                                                    if (emitter->output != emitter_output_json) {
                                                      pcVar28 = " ";
                                                    }
                                                    if (0 < emitter->nesting_depth) {
                                                      iVar21 = emitter->nesting_depth <<
                                                               (emitter->output !=
                                                               emitter_output_json);
                                                      iVar19 = 1;
                                                      if (1 < iVar21) {
                                                        iVar19 = iVar21;
                                                      }
                                                      do {
                                                        emitter_printf(emitter,"%s",pcVar28);
                                                        iVar19 = iVar19 + -1;
                                                      } while (iVar19 != 0);
                                                    }
                                                    emitter_printf(emitter,"]");
                                                  }
                                                  if (cVar18 != '\0') {
                                                    emitter_table_printf
                                                              (emitter,"                     ---\n")
                                                    ;
                                                  }
                                                  goto LAB_00147025;
                                                  }
                                                  pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                                  pcVar28 = "arenas.nlextents";
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                                  pcVar28 = "arenas.nbins";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.extent_avail";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.resident";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.tcache_bytes";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.metadata_thp";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.internal";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.base";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.retained";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.mapped";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.large.nflushes";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.large.nfills";
                                                  }
                                                  }
                                                  else {
                                                    pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.large.nrequests";
                                                  }
                                                }
                                                else {
                                                  pcVar30 = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar28 = "stats.arenas.0.large.ndalloc";
                                                }
                                              }
                                              else {
                                                pcVar30 = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar28 = "stats.arenas.0.large.nmalloc";
                                              }
                                            }
                                            else {
                                              pcVar30 = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar28 = "stats.arenas.0.large.allocated";
                                            }
                                          }
                                          else {
                                            pcVar30 = 
                                            "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                            ;
                                            pcVar28 = "stats.arenas.0.small.nflushes";
                                          }
                                        }
                                        else {
                                          pcVar30 = 
                                          "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                          pcVar28 = "stats.arenas.0.small.nfills";
                                        }
                                      }
                                      else {
                                        pcVar30 = 
                                        "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                        pcVar28 = "stats.arenas.0.small.nrequests";
                                      }
                                    }
                                    else {
                                      pcVar30 = 
                                      "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                      pcVar28 = "stats.arenas.0.small.ndalloc";
                                    }
                                  }
                                  else {
                                    pcVar30 = 
                                    "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                    pcVar28 = "stats.arenas.0.small.nmalloc";
                                  }
                                }
                                else {
                                  pcVar30 = 
                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                  pcVar28 = "stats.arenas.0.small.allocated";
                                }
                              }
                              else {
                                pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                pcVar28 = "stats.arenas.0.muzzy_purged";
                              }
                            }
                            else {
                              pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                              pcVar28 = "stats.arenas.0.muzzy_nmadvise";
                            }
                          }
                          else {
                            pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                            pcVar28 = "stats.arenas.0.muzzy_npurge";
                          }
                        }
                        else {
                          pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                          pcVar28 = "stats.arenas.0.dirty_purged";
                        }
                      }
                      else {
                        pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                        pcVar28 = "stats.arenas.0.dirty_nmadvise";
                      }
                    }
                    else {
                      pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                      pcVar28 = "stats.arenas.0.dirty_npurge";
                    }
                  }
                  else {
                    pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                    pcVar28 = "stats.arenas.0.pmuzzy";
                  }
                }
                else {
                  pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                  pcVar28 = "stats.arenas.0.pdirty";
                }
              }
              else {
                pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                pcVar28 = "stats.arenas.0.pactive";
              }
            }
            else {
              pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar28 = "stats.arenas.0.muzzy_decay_ms";
            }
          }
          else {
            pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar28 = "stats.arenas.0.dirty_decay_ms";
          }
        }
        else {
          pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar28 = "stats.arenas.0.dss";
        }
      }
      else {
        pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar28 = "stats.arenas.0.uptime";
      }
    }
    else {
      pcVar30 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar28 = "stats.arenas.0.nthreads";
    }
  }
  else {
    pcVar30 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar28 = "arenas.page";
  }
LAB_00147fcf:
  malloc_printf(pcVar30,pcVar28);
  abort();
}

Assistant:

static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents) {
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 8, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 8, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
}